

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::LayerNorm_x86_fma::forward_inplace(LayerNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*pauVar8) [32];
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  uint uVar15;
  uint uVar16;
  undefined1 (*pauVar17) [32];
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 (*pauVar21) [32];
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [32];
  float fVar26;
  float fVar27;
  float fVar88;
  float fVar89;
  __m128 _high;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar90;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float _a;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float _b;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar184 [64];
  __m128 _low;
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  __m128 _b_128;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  __m128 _low_1;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar225 [32];
  undefined1 auVar227 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar255 [64];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auVar148 [32];
  undefined1 auVar221 [32];
  undefined1 auVar224 [32];
  undefined1 auVar226 [32];
  
  auVar112 = in_ZMM6._0_16_;
  auVar139 = in_ZMM14._0_16_;
  iVar10 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  pp_Var3 = this->_vptr_LayerNorm_x86_fma;
  p_Var4 = pp_Var3[-3];
  pauVar14 = *(undefined1 (**) [32])(&this->field_0xe0 + (long)p_Var4);
  pauVar25 = *(undefined1 (**) [32])(&this->field_0x128 + (long)p_Var4);
  if (iVar9 == 1) {
    uVar16 = iVar2 * iVar10;
    pauVar17 = (undefined1 (*) [32])bottom_top_blob->data;
    pauVar8 = pauVar17;
    if ((int)uVar16 < 8) {
      uVar15 = 0;
      auVar86 = ZEXT832(0);
    }
    else {
      uVar15 = uVar16 & 0x7ffffff8;
      auVar175 = ZEXT864(0);
      iVar10 = 8;
      do {
        auVar86._0_4_ = auVar175._0_4_ + *(float *)*pauVar8;
        auVar86._4_4_ = auVar175._4_4_ + *(float *)(*pauVar8 + 4);
        auVar86._8_4_ = auVar175._8_4_ + *(float *)(*pauVar8 + 8);
        auVar86._12_4_ = auVar175._12_4_ + *(float *)(*pauVar8 + 0xc);
        auVar86._16_4_ = auVar175._16_4_ + *(float *)(*pauVar8 + 0x10);
        auVar86._20_4_ = auVar175._20_4_ + *(float *)(*pauVar8 + 0x14);
        auVar86._24_4_ = auVar175._24_4_ + *(float *)(*pauVar8 + 0x18);
        auVar86._28_4_ = auVar175._28_4_ + *(float *)(*pauVar8 + 0x1c);
        auVar175 = ZEXT3264(auVar86);
        pauVar8 = pauVar8 + 1;
        iVar10 = iVar10 + 8;
      } while (iVar10 <= (int)uVar16);
    }
    uVar20 = uVar15 | 4;
    auVar112 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar26 = auVar112._4_4_;
      fVar27 = auVar112._8_4_;
      fVar207 = auVar112._12_4_;
      if ((int)uVar16 < (int)uVar20) break;
      auVar112._0_4_ = auVar112._0_4_ + *(float *)*pauVar8;
      auVar112._4_4_ = fVar26 + *(float *)(*pauVar8 + 4);
      auVar112._8_4_ = fVar27 + *(float *)(*pauVar8 + 8);
      auVar112._12_4_ = fVar207 + *(float *)(*pauVar8 + 0xc);
      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
      uVar20 = uVar15 + 8;
      uVar15 = uVar15 + 4;
    }
    fVar88 = 0.0;
    if ((int)uVar15 < (int)uVar16) {
      uVar22 = CONCAT44(0,~uVar15 + uVar16);
      auVar139._8_8_ = 0;
      auVar139._0_8_ = uVar22;
      auVar185 = vpshufd_avx(auVar139,0x44);
      uVar23 = 0;
      auVar167._8_8_ = 0x8000000000000000;
      auVar167._0_8_ = 0x8000000000000000;
      auVar141 = vorps_avx(auVar185,auVar167);
      auVar113 = vorps_avx(auVar185,auVar167);
      auVar168 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      auVar179 = vorps_avx(auVar185,auVar167);
      auVar175 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar184 = auVar175;
        auVar208._8_8_ = 0;
        auVar208._0_8_ = uVar23;
        auVar139 = vpshufd_avx(auVar208,0x44);
        auVar236._16_16_ = auVar139;
        auVar236._0_16_ = auVar139;
        auVar222 = vorps_avx(auVar236,_DAT_0054d840);
        auVar236 = vorps_avx(auVar236,_DAT_0054d860);
        auVar240._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
        auVar240._8_4_ = auVar236._24_4_;
        auVar240._12_4_ = auVar236._28_4_ ^ 0x80000000;
        auVar208 = vpcmpgtq_avx(auVar240,auVar141);
        auVar253._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
        auVar253._8_4_ = auVar236._8_4_;
        auVar253._12_4_ = auVar236._12_4_ ^ 0x80000000;
        auVar139 = vpcmpgtq_avx(auVar253,auVar113);
        auVar140 = vpackssdw_avx(auVar139,auVar208);
        auVar254._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
        auVar254._8_4_ = auVar222._24_4_;
        auVar254._12_4_ = auVar222._28_4_ ^ 0x80000000;
        auVar139 = vpcmpgtq_avx(auVar254,auVar141);
        auVar149._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
        auVar149._8_4_ = auVar222._8_4_;
        auVar149._12_4_ = auVar222._12_4_ ^ 0x80000000;
        auVar149 = vpcmpgtq_avx(auVar149,auVar179);
        auVar149 = vpackssdw_avx(auVar149,auVar139);
        auVar140 = vpackssdw_avx(auVar168 ^ auVar149,auVar140 ^ auVar168);
        auVar149 = vpmovsxwd_avx(auVar140);
        auVar140 = vpunpckhwd_avx(auVar140,auVar140);
        auVar151._16_16_ = auVar140;
        auVar151._0_16_ = auVar149;
        auVar151 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])(*pauVar8 + uVar23 * 4));
        auVar140._0_4_ = auVar151._0_4_ + auVar184._0_4_;
        auVar140._4_4_ = auVar151._4_4_ + auVar184._4_4_;
        auVar140._8_4_ = auVar151._8_4_ + auVar184._8_4_;
        auVar140._12_4_ = auVar151._12_4_ + auVar184._12_4_;
        auVar148._16_4_ = auVar151._16_4_ + auVar184._16_4_;
        auVar148._0_16_ = auVar140;
        auVar148._20_4_ = auVar151._20_4_ + auVar184._20_4_;
        auVar148._24_4_ = auVar151._24_4_ + auVar184._24_4_;
        auVar148._28_4_ = auVar151._28_4_ + auVar184._28_4_;
        uVar23 = uVar23 + 8;
        auVar175 = ZEXT3264(auVar148);
      } while ((uVar22 + 8 & 0x1fffffff8) != uVar23);
      auVar141 = vorps_avx(auVar185,auVar167);
      auVar179._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
      auVar179._8_4_ = auVar236._8_4_;
      auVar179._12_4_ = auVar236._12_4_ ^ 0x80000000;
      auVar141 = vpcmpgtq_avx(auVar179,auVar141);
      auVar113 = vpackssdw_avx(auVar141,auVar208);
      auVar179 = vpcmpeqd_avx(auVar179,auVar179);
      auVar141 = vorps_avx(auVar185,auVar167);
      auVar168._8_4_ = auVar222._8_4_;
      auVar168._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
      auVar168._12_4_ = auVar222._12_4_ ^ 0x80000000;
      auVar141 = vpcmpgtq_avx(auVar168,auVar141);
      auVar141 = vpackssdw_avx(auVar141,auVar139);
      auVar141 = vblendvps_avx(auVar184._0_16_,auVar140,auVar141 ^ auVar179);
      auVar113 = vblendvps_avx(auVar184._16_16_,auVar148._16_16_,auVar113 ^ auVar179);
      auVar141 = vhaddps_avx(auVar113,auVar141);
      auVar141 = vhaddps_avx(auVar141,auVar141);
      auVar141 = vhaddps_avx(auVar141,auVar141);
      fVar88 = auVar141._0_4_;
    }
    auVar141 = vshufpd_avx(auVar112,auVar112,1);
    auVar113._0_4_ = auVar141._0_4_ + auVar112._0_4_;
    auVar113._4_4_ = auVar141._4_4_ + fVar26;
    auVar113._8_4_ = auVar141._8_4_ + fVar27;
    auVar113._12_4_ = auVar141._12_4_ + fVar207;
    auVar112 = vhaddps_avx(auVar86._16_16_,auVar86._0_16_);
    auVar141 = vmovshdup_avx(auVar113);
    auVar112 = vhaddps_avx(auVar112,auVar112);
    auVar112 = vhaddps_avx(auVar112,auVar112);
    auVar185._0_4_ = (float)(int)uVar16;
    auVar185._4_8_ = SUB128(ZEXT812(0),4);
    auVar185._12_4_ = 0;
    fVar26 = (auVar112._0_4_ + auVar141._0_4_ + auVar113._0_4_ + fVar88) / auVar185._0_4_;
    auVar112 = vshufps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),0);
    pauVar8 = pauVar17;
    if ((int)uVar16 < 8) {
      uVar15 = 0;
      auVar141 = ZEXT816(0) << 0x20;
    }
    else {
      auVar222._16_16_ = auVar112;
      auVar222._0_16_ = auVar112;
      uVar15 = uVar16 & 0x7ffffff8;
      auVar141 = ZEXT816(0) << 0x40;
      iVar10 = 8;
      do {
        auVar86 = vsubps_avx(*pauVar8,auVar222);
        auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar86,auVar86);
        pauVar8 = pauVar8 + 1;
        iVar10 = iVar10 + 8;
      } while (iVar10 <= (int)uVar16);
    }
    auVar175 = ZEXT864(0) << 0x20;
    auVar113 = auVar175._0_16_;
    uVar20 = uVar15 | 4;
    while ((int)uVar20 <= (int)uVar16) {
      auVar113 = vsubps_avx(*(undefined1 (*) [16])*pauVar8,auVar112);
      auVar113 = vfmadd231ps_fma(auVar175._0_16_,auVar113,auVar113);
      auVar175 = ZEXT1664(auVar113);
      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
      uVar20 = uVar15 + 8;
      uVar15 = uVar15 + 4;
    }
    fVar27 = 0.0;
    if ((int)uVar15 < (int)uVar16) {
      uVar23 = CONCAT44(0,~uVar15 + uVar16);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar23;
      auVar167 = vpshufd_avx(auVar58,0x44);
      auVar206._16_16_ = auVar112;
      auVar206._0_16_ = auVar112;
      uVar22 = 0;
      auVar180._8_8_ = 0x8000000000000000;
      auVar180._0_8_ = 0x8000000000000000;
      auVar112 = vorps_avx(auVar167,auVar180);
      auVar179 = vorps_avx(auVar167,auVar180);
      auVar168 = vpcmpeqd_avx(auVar139,auVar139);
      auVar139 = vorps_avx(auVar167,auVar180);
      auVar140 = ZEXT816(0) << 0x40;
      do {
        auVar253 = auVar140;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uVar22;
        auVar140 = vpshufd_avx(auVar114,0x44);
        auVar131._16_16_ = auVar140;
        auVar131._0_16_ = auVar140;
        auVar86 = vorps_avx(auVar131,_DAT_0054d840);
        auVar222 = vorps_avx(_DAT_0054d860,auVar131);
        auVar169._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
        auVar169._8_4_ = auVar222._24_4_;
        auVar169._12_4_ = auVar222._28_4_ ^ 0x80000000;
        auVar208 = vpcmpgtq_avx(auVar169,auVar112);
        auVar182._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
        auVar115._8_4_ = auVar222._8_4_;
        auVar182._8_4_ = auVar115._8_4_;
        auVar182._12_4_ = auVar222._12_4_ ^ 0x80000000;
        auVar140 = vpcmpgtq_avx(auVar182,auVar179);
        auVar140 = vpackssdw_avx(auVar140,auVar208);
        auVar183._0_8_ = auVar86._16_8_ ^ 0x8000000000000000;
        auVar183._8_4_ = auVar86._24_4_;
        auVar183._12_4_ = auVar86._28_4_ ^ 0x80000000;
        auVar240 = vpcmpgtq_avx(auVar183,auVar112);
        auVar209._0_8_ = auVar86._0_8_ ^ 0x8000000000000000;
        auVar209._8_4_ = auVar86._8_4_;
        auVar209._12_4_ = auVar86._12_4_ ^ 0x80000000;
        auVar149 = vpcmpgtq_avx(auVar209,auVar139);
        auVar149 = vpackssdw_avx(auVar149,auVar240);
        auVar140 = vpackssdw_avx(auVar149 ^ auVar168,auVar168 ^ auVar140);
        auVar149 = vpmovsxwd_avx(auVar140);
        auVar140 = vpunpckhwd_avx(auVar140,auVar140);
        auVar212._16_16_ = auVar140;
        auVar212._0_16_ = auVar149;
        auVar236 = vmaskmovps_avx(auVar212,*(undefined1 (*) [32])(*pauVar8 + uVar22 * 4));
        auVar236 = vsubps_avx(auVar236,auVar206);
        auVar140 = vfmadd213ps_fma(auVar236,auVar236,ZEXT1632(auVar253));
        uVar22 = uVar22 + 8;
      } while ((uVar23 + 8 & 0x1fffffff8) != uVar22);
      auVar139 = vorps_avx(auVar167,auVar180);
      auVar115._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
      auVar115._12_4_ = auVar222._12_4_ ^ 0x80000000;
      auVar139 = vpcmpgtq_avx(auVar115,auVar139);
      auVar112 = vpackssdw_avx(auVar139,auVar208);
      auVar179 = vpcmpeqd_avx(auVar115,auVar115);
      auVar139 = vorps_avx(auVar167,auVar180);
      auVar139 = vpcmpgtq_avx(auVar86._0_16_ ^ auVar180,auVar139);
      auVar139 = vpackssdw_avx(auVar139,auVar240);
      auVar139 = vblendvps_avx(auVar253,auVar140,auVar139 ^ auVar179);
      auVar112 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar112 ^ auVar179);
      auVar139 = vhaddps_avx(auVar112,auVar139);
      auVar139 = vhaddps_avx(auVar139,auVar139);
      auVar139 = vhaddps_avx(auVar139,auVar139);
      fVar27 = auVar139._0_4_;
      auVar185 = ZEXT416((uint)auVar185._0_4_);
    }
    auVar139 = vshufpd_avx(auVar113,auVar113,1);
    auVar150._0_4_ = auVar139._0_4_ + auVar113._0_4_;
    auVar150._4_4_ = auVar139._4_4_ + auVar113._4_4_;
    auVar150._8_4_ = auVar139._8_4_ + auVar113._8_4_;
    auVar150._12_4_ = auVar139._12_4_ + auVar113._12_4_;
    auVar139 = vhaddps_avx((undefined1  [16])0x0,auVar141);
    auVar112 = vmovshdup_avx(auVar150);
    auVar139 = vhaddps_avx(auVar139,auVar139);
    auVar139 = vhaddps_avx(auVar139,auVar139);
    fVar27 = *(float *)(&this->field_0xd4 + (long)p_Var4) +
             (auVar139._0_4_ + auVar112._0_4_ + auVar150._0_4_ + fVar27) / auVar185._0_4_;
    auVar139 = vrsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
    auVar112 = vfmadd213ss_fma(ZEXT416((uint)(fVar27 * auVar139._0_4_)),auVar139,ZEXT416(0xc0400000)
                              );
    fVar27 = auVar139._0_4_ * -0.5 * auVar112._0_4_;
    fVar26 = fVar27 * -fVar26;
    auVar141 = ZEXT416((uint)fVar27);
    auVar139 = vshufps_avx(auVar141,auVar141,0);
    auVar112 = vshufps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),0);
    auVar174._16_16_ = auVar139;
    auVar174._0_16_ = auVar139;
    auVar181._16_16_ = auVar112;
    auVar181._0_16_ = auVar112;
    uVar15 = 0;
    if (*(int *)(&this->field_0xd8 + (long)p_Var4) == 0) {
      if (7 < (int)uVar16) {
        uVar15 = uVar16 & 0x7ffffff8;
        iVar10 = 8;
        do {
          auVar141 = vfmadd132ps_fma(*pauVar17,auVar181,auVar174);
          *pauVar17 = ZEXT1632(auVar141);
          pauVar17 = pauVar17 + 1;
          iVar10 = iVar10 + 8;
        } while (iVar10 <= (int)uVar16);
      }
      uVar20 = uVar15 | 4;
      auVar86 = _DAT_0054d840;
      auVar222 = _DAT_0054d860;
      while (_DAT_0054d840 = auVar86, _DAT_0054d860 = auVar222, (int)uVar20 <= (int)uVar16) {
        auVar141 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar112,auVar139);
        *(undefined1 (*) [16])*pauVar17 = auVar141;
        pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
        uVar20 = uVar15 + 8;
        uVar15 = uVar15 + 4;
        auVar86 = _DAT_0054d840;
        auVar222 = _DAT_0054d860;
      }
      if ((int)uVar15 < (int)uVar16) {
        uVar23 = CONCAT44(0,uVar16 + ~uVar15);
        auVar141._8_8_ = 0;
        auVar141._0_8_ = uVar23;
        auVar141 = vpshufd_avx(auVar141,0x44);
        auVar132._16_16_ = auVar139;
        auVar132._0_16_ = auVar139;
        auVar87._16_16_ = auVar112;
        auVar87._0_16_ = auVar112;
        uVar22 = 0;
        auVar170._8_8_ = 0x8000000000000000;
        auVar170._0_8_ = 0x8000000000000000;
        auVar139 = vorps_avx(auVar141,auVar170);
        auVar112 = vorps_avx(auVar141,auVar170);
        auVar113 = vpcmpeqd_avx(auVar185,auVar185);
        auVar141 = vorps_avx(auVar141,auVar170);
        do {
          auVar210._8_8_ = 0;
          auVar210._0_8_ = uVar22;
          auVar179 = vpshufd_avx(auVar210,0x44);
          auVar213._16_16_ = auVar179;
          auVar213._0_16_ = auVar179;
          auVar236 = vorps_avx(auVar213,auVar86);
          auVar151 = vorps_avx(auVar213,auVar222);
          auVar231._0_8_ = auVar151._16_8_ ^ 0x8000000000000000;
          auVar231._8_4_ = auVar151._24_4_;
          auVar231._12_4_ = auVar151._28_4_ ^ 0x80000000;
          auVar179 = vpcmpgtq_avx(auVar231,auVar139);
          auVar211._0_8_ = auVar151._0_8_ ^ 0x8000000000000000;
          auVar211._8_4_ = auVar151._8_4_;
          auVar211._12_4_ = auVar151._12_4_ ^ 0x80000000;
          auVar168 = vpcmpgtq_avx(auVar211,auVar112);
          auVar179 = vpackssdw_avx(auVar168,auVar179);
          auVar232._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
          auVar232._8_4_ = auVar236._24_4_;
          auVar232._12_4_ = auVar236._28_4_ ^ 0x80000000;
          auVar168 = vpcmpgtq_avx(auVar232,auVar139);
          auVar220._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
          auVar220._8_4_ = auVar236._8_4_;
          auVar220._12_4_ = auVar236._12_4_ ^ 0x80000000;
          auVar185 = vpcmpgtq_avx(auVar220,auVar141);
          auVar168 = vpackssdw_avx(auVar185,auVar168);
          auVar179 = vpackssdw_avx(auVar168 ^ auVar113,auVar179 ^ auVar113);
          auVar168 = vpmovsxwd_avx(auVar179);
          auVar179 = vpunpckhwd_avx(auVar179,auVar179);
          auVar214._16_16_ = auVar179;
          auVar214._0_16_ = auVar168;
          auVar236 = vmaskmovps_avx(auVar214,*(undefined1 (*) [32])(*pauVar17 + uVar22 * 4));
          auVar179 = vfmadd213ps_fma(auVar236,auVar132,auVar87);
          auVar236 = vmaskmovps_avx(auVar214,ZEXT1632(auVar179));
          *(undefined1 (*) [32])(*pauVar17 + uVar22 * 4) = auVar236;
          uVar22 = uVar22 + 8;
        } while ((uVar23 + 8 & 0x1fffffff8) != uVar22);
      }
    }
    else {
      if (7 < (int)uVar16) {
        uVar15 = uVar16 & 0x7ffffff8;
        iVar10 = 8;
        do {
          auVar113 = vfmadd132ps_fma(*pauVar17,auVar181,auVar174);
          auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),*pauVar14,*pauVar25);
          *pauVar17 = ZEXT1632(auVar113);
          pauVar17 = pauVar17 + 1;
          pauVar14 = pauVar14 + 1;
          pauVar25 = pauVar25 + 1;
          iVar10 = iVar10 + 8;
        } while (iVar10 <= (int)uVar16);
      }
      uVar20 = uVar15 | 4;
      while ((int)uVar20 <= (int)uVar16) {
        auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar112,auVar139);
        auVar113 = vfmadd213ps_fma(auVar113,*(undefined1 (*) [16])*pauVar14,
                                   *(undefined1 (*) [16])*pauVar25);
        *(undefined1 (*) [16])*pauVar17 = auVar113;
        pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
        pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
        uVar20 = uVar15 + 8;
        uVar15 = uVar15 + 4;
      }
      if (uVar16 - uVar15 != 0 && (int)uVar15 <= (int)uVar16) {
        lVar13 = 0;
        do {
          auVar139 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar17 + lVar13 * 4)),
                                     ZEXT416((uint)fVar26),auVar141);
          auVar139 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar14 + lVar13 * 4)),auVar139,
                                     ZEXT416(*(uint *)(*pauVar25 + lVar13 * 4)));
          *(int *)(*pauVar17 + lVar13 * 4) = auVar139._0_4_;
          lVar13 = lVar13 + 1;
        } while (uVar16 - uVar15 != (int)lVar13);
      }
    }
  }
  else {
    uVar16 = bottom_top_blob->h;
    uVar15 = bottom_top_blob->c;
    if (iVar9 == 3) {
      if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) == iVar2) {
        if (0 < (int)uVar15) {
          pp_Var3 = this->_vptr_LayerNorm_x86_fma;
          uVar20 = iVar2 * iVar10;
          fVar26 = 1.0 / (float)iVar2;
          auVar141 = vshufps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),0);
          uVar24 = uVar20 & 0xfffffff8;
          uVar22 = 0;
          auVar175 = ZEXT3264(_DAT_0054d840);
          auVar255 = ZEXT3264(_DAT_0054d860);
          auVar177._8_8_ = 0x8000000000000000;
          auVar177._0_8_ = 0x8000000000000000;
          auVar139 = vpcmpeqd_avx(auVar112,auVar112);
          auVar184 = ZEXT1664(auVar139);
          do {
            if (0 < (int)uVar16) {
              uVar23 = 0;
              do {
                pauVar17 = (undefined1 (*) [32])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar23 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * uVar22 * bottom_top_blob->elemsize);
                pauVar8 = pauVar17;
                if ((int)uVar20 < 8) {
                  auVar188 = ZEXT832(0);
                  uVar11 = 0;
                }
                else {
                  auVar192 = ZEXT864(0);
                  iVar9 = 8;
                  do {
                    auVar188._0_4_ = auVar192._0_4_ + *(float *)*pauVar8;
                    auVar188._4_4_ = auVar192._4_4_ + *(float *)(*pauVar8 + 4);
                    auVar188._8_4_ = auVar192._8_4_ + *(float *)(*pauVar8 + 8);
                    auVar188._12_4_ = auVar192._12_4_ + *(float *)(*pauVar8 + 0xc);
                    auVar188._16_4_ = auVar192._16_4_ + *(float *)(*pauVar8 + 0x10);
                    auVar188._20_4_ = auVar192._20_4_ + *(float *)(*pauVar8 + 0x14);
                    auVar188._24_4_ = auVar192._24_4_ + *(float *)(*pauVar8 + 0x18);
                    auVar188._28_4_ = auVar192._28_4_ + *(float *)(*pauVar8 + 0x1c);
                    auVar192 = ZEXT3264(auVar188);
                    pauVar8 = pauVar8 + 1;
                    iVar9 = iVar9 + 8;
                    uVar11 = uVar24;
                  } while (iVar9 <= (int)uVar20);
                }
                uVar18 = uVar11 | 4;
                auVar199 = ZEXT816(0) << 0x40;
                while( true ) {
                  fVar27 = auVar199._4_4_;
                  fVar207 = auVar199._8_4_;
                  fVar88 = auVar199._12_4_;
                  if ((int)uVar20 < (int)uVar18) break;
                  auVar199._0_4_ = auVar199._0_4_ + *(float *)*pauVar8;
                  auVar199._4_4_ = fVar27 + *(float *)(*pauVar8 + 4);
                  auVar199._8_4_ = fVar207 + *(float *)(*pauVar8 + 8);
                  auVar199._12_4_ = fVar88 + *(float *)(*pauVar8 + 0xc);
                  pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
                  uVar18 = uVar11 + 8;
                  uVar11 = uVar11 + 4;
                }
                fVar89 = 0.0;
                auVar86 = auVar175._0_32_;
                auVar139 = auVar184._0_16_;
                if ((int)uVar11 < (int)uVar20) {
                  uVar12 = CONCAT44(0,~uVar11 + uVar20);
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = uVar12;
                  auVar179 = vpshufd_avx(auVar38,0x44);
                  auVar112 = vorps_avx(auVar179,auVar177);
                  auVar113 = vorps_avx(auVar179,auVar177);
                  uVar19 = 0;
                  auVar192 = ZEXT464(0) << 0x40;
                  do {
                    auVar193 = auVar192;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar19;
                    auVar168 = vpshufd_avx(auVar39,0x44);
                    auVar68._16_16_ = auVar168;
                    auVar68._0_16_ = auVar168;
                    auVar222 = vorps_avx(auVar68,auVar86);
                    auVar236 = vorps_avx(auVar255._0_32_,auVar68);
                    auVar168 = vorps_avx(auVar179,auVar177);
                    auVar40._8_4_ = auVar236._24_4_;
                    auVar40._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
                    auVar40._12_4_ = auVar236._28_4_ ^ 0x80000000;
                    auVar167 = vpcmpgtq_avx(auVar40,auVar168);
                    auVar98._8_4_ = auVar236._8_4_;
                    auVar238._8_4_ = auVar98._8_4_;
                    auVar238._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
                    auVar238._12_4_ = auVar236._12_4_ ^ 0x80000000;
                    auVar185 = vpcmpgtq_avx(auVar238,auVar112);
                    auVar185 = vpackssdw_avx(auVar185,auVar167);
                    auVar249._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
                    auVar249._8_4_ = auVar222._24_4_;
                    auVar249._12_4_ = auVar222._28_4_ ^ 0x80000000;
                    auVar140 = vpcmpgtq_avx(auVar249,auVar168);
                    auVar250._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
                    auVar250._8_4_ = auVar222._8_4_;
                    auVar250._12_4_ = auVar222._12_4_ ^ 0x80000000;
                    auVar168 = vpcmpgtq_avx(auVar250,auVar113);
                    auVar168 = vpackssdw_avx(auVar168,auVar140);
                    auVar168 = vpackssdw_avx(auVar168 ^ auVar139,auVar185 ^ auVar139);
                    auVar185 = vpmovsxwd_avx(auVar168);
                    auVar168 = vpunpckhwd_avx(auVar168,auVar168);
                    auVar243._16_16_ = auVar168;
                    auVar243._0_16_ = auVar185;
                    auVar151 = vmaskmovps_avx(auVar243,*(undefined1 (*) [32])(*pauVar8 + uVar19 * 4)
                                             );
                    auVar218._0_4_ = auVar151._0_4_ + auVar193._0_4_;
                    auVar218._4_4_ = auVar151._4_4_ + auVar193._4_4_;
                    auVar218._8_4_ = auVar151._8_4_ + auVar193._8_4_;
                    auVar218._12_4_ = auVar151._12_4_ + auVar193._12_4_;
                    auVar224._16_4_ = auVar151._16_4_ + auVar193._16_4_;
                    auVar224._0_16_ = auVar218;
                    auVar224._20_4_ = auVar151._20_4_ + auVar193._20_4_;
                    auVar224._24_4_ = auVar151._24_4_ + auVar193._24_4_;
                    auVar224._28_4_ = auVar151._28_4_ + auVar193._28_4_;
                    uVar19 = uVar19 + 8;
                    auVar192 = ZEXT3264(auVar224);
                  } while ((uVar12 + 8 & 0x1fffffff8) != uVar19);
                  auVar112 = vorps_avx(auVar179,auVar177);
                  auVar98._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
                  auVar98._12_4_ = auVar236._12_4_ ^ 0x80000000;
                  auVar112 = vpcmpgtq_avx(auVar98,auVar112);
                  auVar113 = vpackssdw_avx(auVar112,auVar167);
                  auVar112 = vorps_avx(auVar179,auVar177);
                  auVar135._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
                  auVar135._8_4_ = auVar222._8_4_;
                  auVar135._12_4_ = auVar222._12_4_ ^ 0x80000000;
                  auVar112 = vpcmpgtq_avx(auVar135,auVar112);
                  auVar112 = vpackssdw_avx(auVar112,auVar140);
                  auVar112 = vblendvps_avx(auVar193._0_16_,auVar218,auVar112 ^ auVar139);
                  auVar113 = vblendvps_avx(auVar193._16_16_,auVar224._16_16_,auVar113 ^ auVar139);
                  auVar112 = vhaddps_avx(auVar113,auVar112);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  fVar89 = auVar112._0_4_;
                }
                local_78 = auVar141._0_4_;
                fStack_74 = auVar141._4_4_;
                fStack_70 = auVar141._8_4_;
                fStack_6c = auVar141._12_4_;
                if (iVar10 == 4) {
                  auVar199._0_4_ = auVar199._0_4_ + auVar188._16_4_ + auVar188._0_4_;
                  auVar199._4_4_ = fVar27 + auVar188._20_4_ + auVar188._4_4_;
                  auVar199._8_4_ = fVar207 + auVar188._24_4_ + auVar188._8_4_;
                  auVar199._12_4_ = fVar88 + auVar188._28_4_ + auVar188._12_4_;
                  auVar192 = ZEXT1664(CONCAT412(auVar199._12_4_ * fStack_6c,
                                                CONCAT48(auVar199._8_4_ * fStack_70,
                                                         CONCAT44(auVar199._4_4_ * fStack_74,
                                                                  auVar199._0_4_ * local_78))));
                }
                else {
                  auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (iVar10 == 8) {
                    auVar192 = ZEXT2864(CONCAT424(auVar188._24_4_ * fStack_70,
                                                  CONCAT420(auVar188._20_4_ * fStack_74,
                                                            CONCAT416(auVar188._16_4_ * local_78,
                                                                      CONCAT412(auVar188._12_4_ *
                                                                                fStack_6c,
                                                                                CONCAT48(auVar188.
                                                  _8_4_ * fStack_70,
                                                  CONCAT44(auVar188._4_4_ * fStack_74,
                                                           auVar188._0_4_ * local_78)))))));
                  }
                }
                if (iVar10 == 1) {
                  auVar112 = vshufpd_avx(auVar199,auVar199,1);
                  auVar99._0_4_ = auVar199._0_4_ + auVar112._0_4_;
                  auVar99._4_4_ = auVar199._4_4_ + auVar112._4_4_;
                  auVar99._8_4_ = auVar199._8_4_ + auVar112._8_4_;
                  auVar99._12_4_ = auVar199._12_4_ + auVar112._12_4_;
                  auVar112 = vhaddps_avx(auVar188._16_16_,auVar188._0_16_);
                  auVar113 = vmovshdup_avx(auVar99);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  auVar222 = vblendps_avx(auVar192._0_32_,
                                          ZEXT432((uint)((auVar112._0_4_ + auVar99._0_4_ +
                                                         fVar89 + auVar113._0_4_) * fVar26)),1);
                  auVar192 = ZEXT3264(auVar222);
                }
                auVar113 = auVar192._0_16_;
                auVar112 = auVar113;
                if (iVar10 != 4) {
                  auVar112 = vshufps_avx(auVar113,auVar113,0);
                }
                auVar69 = auVar192._0_32_;
                if (iVar10 != 8) {
                  auVar69._16_16_ = auVar112;
                  auVar69._0_16_ = auVar112;
                }
                pauVar8 = pauVar17;
                if ((int)uVar20 < 8) {
                  auVar222 = SUB6432(ZEXT864(0),0) << 0x20;
                  uVar11 = 0;
                }
                else {
                  auVar193 = ZEXT864(0) << 0x20;
                  iVar9 = 8;
                  do {
                    auVar222 = vsubps_avx(*pauVar8,auVar69);
                    auVar179 = vfmadd231ps_fma(auVar193._0_32_,auVar222,auVar222);
                    auVar193 = ZEXT1664(auVar179);
                    auVar222 = ZEXT1632(auVar179);
                    pauVar8 = pauVar8 + 1;
                    iVar9 = iVar9 + 8;
                    uVar11 = uVar24;
                  } while (iVar9 <= (int)uVar20);
                }
                auVar179 = ZEXT816(0) << 0x40;
                uVar18 = uVar11 | 4;
                while ((int)uVar18 <= (int)uVar20) {
                  auVar168 = vsubps_avx(*(undefined1 (*) [16])*pauVar8,auVar112);
                  auVar179 = vfmadd231ps_fma(auVar179,auVar168,auVar168);
                  pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
                  uVar18 = uVar11 + 8;
                  uVar11 = uVar11 + 4;
                }
                fVar27 = 0.0;
                if ((int)uVar11 < (int)uVar20) {
                  uVar12 = CONCAT44(0,~uVar11 + uVar20);
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = uVar12;
                  auVar168 = vpshufd_avx(auVar41,0x44);
                  auVar112 = vshufps_avx(auVar113,auVar113,0);
                  auVar244._16_16_ = auVar112;
                  auVar244._0_16_ = auVar112;
                  auVar112 = vorps_avx(auVar168,auVar177);
                  auVar113 = vorps_avx(auVar168,auVar177);
                  uVar19 = 0;
                  auVar139 = vpcmpeqd_avx(auVar139,auVar139);
                  auVar185 = ZEXT416(0) << 0x40;
                  do {
                    auVar208 = auVar185;
                    auVar100._8_8_ = 0;
                    auVar100._0_8_ = uVar19;
                    auVar185 = vpshufd_avx(auVar100,0x44);
                    auVar121._16_16_ = auVar185;
                    auVar121._0_16_ = auVar185;
                    auVar236 = vorps_avx(auVar86,auVar121);
                    auVar151 = vorps_avx(auVar121,_DAT_0054d860);
                    auVar185 = vorps_avx(auVar168,auVar177);
                    auVar200._0_8_ = auVar151._16_8_ ^ 0x8000000000000000;
                    auVar200._8_4_ = auVar151._24_4_;
                    auVar200._12_4_ = auVar151._28_4_ ^ 0x80000000;
                    auVar140 = vpcmpgtq_avx(auVar200,auVar185);
                    auVar234._0_8_ = auVar151._0_8_ ^ 0x8000000000000000;
                    auVar101._8_4_ = auVar151._8_4_;
                    auVar234._8_4_ = auVar101._8_4_;
                    auVar234._12_4_ = auVar151._12_4_ ^ 0x80000000;
                    auVar167 = vpcmpgtq_avx(auVar234,auVar112);
                    auVar167 = vpackssdw_avx(auVar167,auVar140);
                    auVar157._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
                    auVar157._8_4_ = auVar236._24_4_;
                    auVar157._12_4_ = auVar236._28_4_ ^ 0x80000000;
                    auVar149 = vpcmpgtq_avx(auVar157,auVar185);
                    auVar158._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
                    auVar158._8_4_ = auVar236._8_4_;
                    auVar158._12_4_ = auVar236._12_4_ ^ 0x80000000;
                    auVar185 = vpcmpgtq_avx(auVar158,auVar113);
                    auVar185 = vpackssdw_avx(auVar185,auVar149);
                    auVar185 = vpackssdw_avx(auVar185 ^ auVar139,auVar167 ^ auVar139);
                    auVar167 = vpmovsxwd_avx(auVar185);
                    auVar185 = vpunpckhwd_avx(auVar185,auVar185);
                    auVar172._16_16_ = auVar185;
                    auVar172._0_16_ = auVar167;
                    auVar148 = vmaskmovps_avx(auVar172,*(undefined1 (*) [32])(*pauVar8 + uVar19 * 4)
                                             );
                    auVar148 = vsubps_avx(auVar148,auVar244);
                    auVar185 = vfmadd213ps_fma(auVar148,auVar148,ZEXT1632(auVar208));
                    uVar19 = uVar19 + 8;
                  } while ((uVar12 + 8 & 0x1fffffff8) != uVar19);
                  auVar112 = vorps_avx(auVar168,auVar177);
                  auVar101._0_8_ = auVar151._0_8_ ^ 0x8000000000000000;
                  auVar101._12_4_ = auVar151._12_4_ ^ 0x80000000;
                  auVar112 = vpcmpgtq_avx(auVar101,auVar112);
                  auVar113 = vpackssdw_avx(auVar112,auVar140);
                  auVar112 = vorps_avx(auVar168,auVar177);
                  auVar159._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
                  auVar159._8_4_ = auVar236._8_4_;
                  auVar159._12_4_ = auVar236._12_4_ ^ 0x80000000;
                  auVar112 = vpcmpgtq_avx(auVar159,auVar112);
                  auVar112 = vpackssdw_avx(auVar112,auVar149);
                  auVar112 = vblendvps_avx(auVar208,auVar185,auVar112 ^ auVar139);
                  auVar113 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,
                                           auVar113 ^ auVar139);
                  auVar112 = vhaddps_avx(auVar113,auVar112);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  fVar27 = auVar112._0_4_;
                  auVar175 = ZEXT3264(auVar86);
                  auVar255 = ZEXT3264(_DAT_0054d860);
                  auVar139 = vpcmpeqd_avx(auVar139,auVar139);
                  auVar184 = ZEXT1664(auVar139);
                  auVar192 = ZEXT3264(auVar192._0_32_);
                }
                auVar139 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]));
                auVar74 = auVar192._0_32_;
                auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
                if (iVar10 == 8) {
                  auVar193 = ZEXT2864(CONCAT424(auVar222._24_4_ * fStack_70,
                                                CONCAT420(auVar222._20_4_ * fStack_74,
                                                          CONCAT416(auVar222._16_4_ * local_78,
                                                                    CONCAT412(auVar222._12_4_ *
                                                                              fStack_6c,
                                                                              CONCAT48(auVar222.
                                                  _8_4_ * fStack_70,
                                                  CONCAT44(auVar222._4_4_ * fStack_74,
                                                           auVar222._0_4_ * local_78)))))));
                }
                auVar229 = auVar179;
                if (iVar10 == 4) {
                  auVar229._0_4_ = auVar179._0_4_ + auVar222._0_4_ + auVar222._16_4_;
                  auVar229._4_4_ = auVar179._4_4_ + auVar222._4_4_ + auVar222._20_4_;
                  auVar229._8_4_ = auVar179._8_4_ + auVar222._8_4_ + auVar222._24_4_;
                  auVar229._12_4_ = auVar179._12_4_ + auVar222._12_4_ + auVar222._28_4_;
                  auVar86 = vblendps_avx(auVar193._0_32_,
                                         ZEXT1632(CONCAT412(auVar229._12_4_ * fStack_6c,
                                                            CONCAT48(auVar229._8_4_ * fStack_70,
                                                                     CONCAT44(auVar229._4_4_ *
                                                                              fStack_74,
                                                                              auVar229._0_4_ *
                                                                              local_78)))),0xf);
                  auVar193 = ZEXT3264(auVar86);
                }
                if (iVar10 == 1) {
                  auVar112 = vshufpd_avx(auVar229,auVar229,1);
                  auVar102._0_4_ = auVar229._0_4_ + auVar112._0_4_;
                  auVar102._4_4_ = auVar229._4_4_ + auVar112._4_4_;
                  auVar102._8_4_ = auVar229._8_4_ + auVar112._8_4_;
                  auVar102._12_4_ = auVar229._12_4_ + auVar112._12_4_;
                  auVar112 = vhaddps_avx(auVar222._16_16_,auVar222._0_16_);
                  auVar113 = vmovshdup_avx(auVar102);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  auVar112 = vhaddps_avx(auVar112,auVar112);
                  auVar86 = vblendps_avx(auVar193._0_32_,
                                         ZEXT432((uint)((fVar27 + auVar112._0_4_ + auVar113._0_4_ +
                                                        auVar102._0_4_) * fVar26)),1);
                  auVar193 = ZEXT3264(auVar86);
                }
                fVar27 = auVar193._0_4_;
                auVar125 = auVar193._0_32_;
                fVar207 = auVar192._0_4_;
                if (iVar10 == 1) {
                  fVar27 = fVar27 + *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
                  auVar139 = vrsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
                  auVar112 = vfmadd213ss_fma(ZEXT416((uint)(fVar27 * auVar139._0_4_)),auVar139,
                                             ZEXT416(0xc0400000));
                  fVar27 = auVar139._0_4_ * -0.5 * auVar112._0_4_;
                  auVar125 = vblendps_avx(auVar125,ZEXT432((uint)fVar27),1);
                  auVar74 = vblendps_avx(auVar74,ZEXT432((uint)(fVar27 * -fVar207)),1);
                }
                else if (iVar10 == 4) {
                  auVar139 = vshufps_avx(auVar139,auVar139,0);
                  auVar42._0_4_ = fVar27 + auVar139._0_4_;
                  auVar42._4_4_ = auVar193._4_4_ + auVar139._4_4_;
                  auVar42._8_4_ = auVar193._8_4_ + auVar139._8_4_;
                  auVar42._12_4_ = auVar193._12_4_ + auVar139._12_4_;
                  auVar139 = vrsqrtps_avx(auVar42);
                  auVar43._0_4_ = auVar42._0_4_ * auVar139._0_4_;
                  auVar43._4_4_ = auVar42._4_4_ * auVar139._4_4_;
                  auVar43._8_4_ = auVar42._8_4_ * auVar139._8_4_;
                  auVar43._12_4_ = auVar42._12_4_ * auVar139._12_4_;
                  auVar136._8_4_ = 0xc0400000;
                  auVar136._0_8_ = 0xc0400000c0400000;
                  auVar136._12_4_ = 0xc0400000;
                  auVar112 = vfmadd213ps_fma(auVar43,auVar139,auVar136);
                  fVar27 = auVar139._0_4_ * -0.5 * auVar112._0_4_;
                  fVar88 = auVar139._4_4_ * -0.5 * auVar112._4_4_;
                  fVar89 = auVar139._8_4_ * -0.5 * auVar112._8_4_;
                  fVar90 = auVar139._12_4_ * -0.5 * auVar112._12_4_;
                  auVar125 = vblendps_avx(auVar125,ZEXT1632(CONCAT412(fVar90,CONCAT48(fVar89,
                                                  CONCAT44(fVar88,fVar27)))),0xf);
                  auVar74 = vblendps_avx(auVar74,ZEXT1632(CONCAT412(fVar90 * -auVar192._12_4_,
                                                                    CONCAT48(fVar89 * -auVar192.
                                                  _8_4_,CONCAT44(fVar88 * -auVar192._4_4_,
                                                                 fVar27 * -fVar207)))),0xf);
                }
                else if (iVar10 == 8) {
                  auVar139 = vshufps_avx(auVar139,auVar139,0);
                  auVar70._0_4_ = fVar27 + auVar139._0_4_;
                  auVar70._4_4_ = auVar193._4_4_ + auVar139._4_4_;
                  auVar70._8_4_ = auVar193._8_4_ + auVar139._8_4_;
                  auVar70._12_4_ = auVar193._12_4_ + auVar139._12_4_;
                  auVar70._16_4_ = auVar193._16_4_ + auVar139._0_4_;
                  auVar70._20_4_ = auVar193._20_4_ + auVar139._4_4_;
                  auVar70._24_4_ = auVar193._24_4_ + auVar139._8_4_;
                  auVar70._28_4_ = auVar193._28_4_ + auVar139._12_4_;
                  auVar86 = vrsqrtps_avx(auVar70);
                  auVar6._4_4_ = auVar70._4_4_ * auVar86._4_4_;
                  auVar6._0_4_ = auVar70._0_4_ * auVar86._0_4_;
                  auVar6._8_4_ = auVar70._8_4_ * auVar86._8_4_;
                  auVar6._12_4_ = auVar70._12_4_ * auVar86._12_4_;
                  auVar6._16_4_ = auVar70._16_4_ * auVar86._16_4_;
                  auVar6._20_4_ = auVar70._20_4_ * auVar86._20_4_;
                  auVar6._24_4_ = auVar70._24_4_ * auVar86._24_4_;
                  auVar6._28_4_ = auVar70._28_4_;
                  auVar144._8_4_ = 0xc0400000;
                  auVar144._0_8_ = 0xc0400000c0400000;
                  auVar144._12_4_ = 0xc0400000;
                  auVar144._16_4_ = 0xc0400000;
                  auVar144._20_4_ = 0xc0400000;
                  auVar144._24_4_ = 0xc0400000;
                  auVar144._28_4_ = 0xc0400000;
                  auVar139 = vfmadd213ps_fma(auVar6,auVar86,auVar144);
                  auVar195._0_4_ = auVar86._0_4_ * -0.5 * auVar139._0_4_;
                  auVar195._4_4_ = auVar86._4_4_ * -0.5 * auVar139._4_4_;
                  auVar195._8_4_ = auVar86._8_4_ * -0.5 * auVar139._8_4_;
                  auVar195._12_4_ = auVar86._12_4_ * -0.5 * auVar139._12_4_;
                  auVar195._16_4_ = auVar86._16_4_ * -0.5 * 0.0;
                  auVar195._20_4_ = auVar86._20_4_ * -0.5 * 0.0;
                  auVar195._28_36_ = auVar193._28_36_;
                  auVar195._24_4_ = auVar86._24_4_ * -0.5 * 0.0;
                  auVar125 = auVar195._0_32_;
                  auVar215._0_4_ = auVar195._0_4_ * -fVar207;
                  auVar215._4_4_ = auVar195._4_4_ * -auVar192._4_4_;
                  auVar215._8_4_ = auVar195._8_4_ * -auVar192._8_4_;
                  auVar215._12_4_ = auVar195._12_4_ * -auVar192._12_4_;
                  auVar215._16_4_ = auVar195._16_4_ * -auVar192._16_4_;
                  auVar215._20_4_ = auVar195._20_4_ * -auVar192._20_4_;
                  auVar215._28_36_ = auVar192._28_36_;
                  auVar215._24_4_ = auVar195._24_4_ * -auVar192._24_4_;
                  auVar74 = auVar215._0_32_;
                }
                auVar139 = auVar125._0_16_;
                auVar112 = auVar74._0_16_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
                  auVar179 = auVar112;
                  auVar113 = auVar139;
                  if (iVar10 != 4) {
                    auVar113 = vshufps_avx(auVar139,auVar139,0);
                    auVar179 = vshufps_avx(auVar112,auVar112,0);
                  }
                  if (iVar10 != 8) {
                    auVar125._16_16_ = auVar113;
                    auVar125._0_16_ = auVar113;
                    auVar74._16_16_ = auVar179;
                    auVar74._0_16_ = auVar179;
                  }
                  uVar11 = 0;
                  if (7 < (int)uVar20) {
                    iVar9 = 8;
                    do {
                      auVar168 = vfmadd132ps_fma(*pauVar17,auVar74,auVar125);
                      *pauVar17 = ZEXT1632(auVar168);
                      pauVar17 = pauVar17 + 1;
                      iVar9 = iVar9 + 8;
                      uVar11 = uVar24;
                    } while (iVar9 <= (int)uVar20);
                  }
                  uVar18 = uVar11 | 4;
                  while ((int)uVar18 <= (int)uVar20) {
                    auVar168 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar179,auVar113);
                    *(undefined1 (*) [16])*pauVar17 = auVar168;
                    pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                    uVar18 = uVar11 + 8;
                    uVar11 = uVar11 + 4;
                  }
                  if ((int)uVar11 < (int)uVar20) {
                    uVar12 = CONCAT44(0,~uVar11 + uVar20);
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar12;
                    auVar113 = vpshufd_avx(auVar45,0x44);
                    auVar139 = vshufps_avx(auVar139,auVar139,0);
                    auVar189._16_16_ = auVar139;
                    auVar189._0_16_ = auVar139;
                    auVar139 = vshufps_avx(auVar112,auVar112,0);
                    auVar225._16_16_ = auVar139;
                    auVar225._0_16_ = auVar139;
                    auVar139 = vorps_avx(auVar113,auVar177);
                    auVar112 = vorps_avx(auVar113,auVar177);
                    uVar19 = 0;
                    do {
                      auVar46._8_8_ = 0;
                      auVar46._0_8_ = uVar19;
                      auVar179 = vpshufd_avx(auVar46,0x44);
                      auVar75._16_16_ = auVar179;
                      auVar75._0_16_ = auVar179;
                      auVar86 = vorps_avx(auVar75,auVar175._0_32_);
                      auVar222 = vorps_avx(auVar255._0_32_,auVar75);
                      auVar179 = vorps_avx(auVar113,auVar177);
                      auVar160._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
                      auVar160._8_4_ = auVar222._24_4_;
                      auVar160._12_4_ = auVar222._28_4_ ^ 0x80000000;
                      auVar168 = vpcmpgtq_avx(auVar160,auVar179);
                      auVar47._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
                      auVar47._8_4_ = auVar222._8_4_;
                      auVar47._12_4_ = auVar222._12_4_ ^ 0x80000000;
                      auVar185 = vpcmpgtq_avx(auVar47,auVar139);
                      auVar168 = vpackssdw_avx(auVar185,auVar168);
                      auVar161._0_8_ = auVar86._16_8_ ^ 0x8000000000000000;
                      auVar161._8_4_ = auVar86._24_4_;
                      auVar161._12_4_ = auVar86._28_4_ ^ 0x80000000;
                      auVar179 = vpcmpgtq_avx(auVar161,auVar179);
                      auVar175 = ZEXT3264(auVar175._0_32_);
                      auVar104._0_8_ = auVar86._0_8_ ^ 0x8000000000000000;
                      auVar104._8_4_ = auVar86._8_4_;
                      auVar104._12_4_ = auVar86._12_4_ ^ 0x80000000;
                      auVar185 = vpcmpgtq_avx(auVar104,auVar112);
                      auVar179 = vpackssdw_avx(auVar185,auVar179);
                      auVar179 = vpackssdw_avx(auVar179 ^ auVar184._0_16_,auVar168 ^ auVar184._0_16_
                                              );
                      auVar168 = vpmovsxwd_avx(auVar179);
                      auVar179 = vpunpckhwd_avx(auVar179,auVar179);
                      auVar76._16_16_ = auVar179;
                      auVar76._0_16_ = auVar168;
                      auVar86 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])
                                                        (*pauVar17 + uVar19 * 4));
                      auVar179 = vfmadd213ps_fma(auVar86,auVar189,auVar225);
                      auVar86 = vmaskmovps_avx(auVar76,ZEXT1632(auVar179));
                      *(undefined1 (*) [32])(*pauVar17 + uVar19 * 4) = auVar86;
                      uVar19 = uVar19 + 8;
                    } while ((uVar12 + 8 & 0x1fffffff8) != uVar19);
                  }
                }
                else {
                  pauVar8 = pauVar25;
                  pauVar21 = pauVar14;
                  if (7 < (int)uVar20 && iVar10 == 8) {
                    iVar9 = 8;
                    do {
                      uVar1 = *(undefined4 *)*pauVar21;
                      auVar71._4_4_ = uVar1;
                      auVar71._0_4_ = uVar1;
                      auVar71._8_4_ = uVar1;
                      auVar71._12_4_ = uVar1;
                      auVar71._16_4_ = uVar1;
                      auVar71._20_4_ = uVar1;
                      auVar71._24_4_ = uVar1;
                      auVar71._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)*pauVar8;
                      auVar122._4_4_ = uVar1;
                      auVar122._0_4_ = uVar1;
                      auVar122._8_4_ = uVar1;
                      auVar122._12_4_ = uVar1;
                      auVar122._16_4_ = uVar1;
                      auVar122._20_4_ = uVar1;
                      auVar122._24_4_ = uVar1;
                      auVar122._28_4_ = uVar1;
                      auVar113 = vfmadd132ps_fma(*pauVar17,auVar74,auVar125);
                      auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar71,auVar122);
                      *pauVar17 = ZEXT1632(auVar113);
                      pauVar17 = pauVar17 + 1;
                      pauVar21 = (undefined1 (*) [32])(*pauVar21 + 4);
                      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 4);
                      iVar9 = iVar9 + 8;
                    } while (iVar9 <= (int)uVar20);
                  }
                  if (iVar10 == 4) {
                    uVar11 = 4;
                    if (7 < (int)uVar20) {
                      auVar145._16_16_ = auVar139;
                      auVar145._0_16_ = auVar139;
                      auVar204._16_16_ = auVar112;
                      auVar204._0_16_ = auVar112;
                      iVar9 = 8;
                      do {
                        uVar1 = *(undefined4 *)*pauVar21;
                        auVar72._4_4_ = uVar1;
                        auVar72._0_4_ = uVar1;
                        auVar72._8_4_ = uVar1;
                        auVar72._12_4_ = uVar1;
                        uVar1 = *(undefined4 *)(*pauVar21 + 4);
                        auVar72._20_4_ = uVar1;
                        auVar72._16_4_ = uVar1;
                        auVar72._24_4_ = uVar1;
                        auVar72._28_4_ = uVar1;
                        uVar1 = *(undefined4 *)*pauVar8;
                        auVar123._4_4_ = uVar1;
                        auVar123._0_4_ = uVar1;
                        auVar123._8_4_ = uVar1;
                        auVar123._12_4_ = uVar1;
                        uVar1 = *(undefined4 *)(*pauVar8 + 4);
                        auVar123._20_4_ = uVar1;
                        auVar123._16_4_ = uVar1;
                        auVar123._24_4_ = uVar1;
                        auVar123._28_4_ = uVar1;
                        auVar113 = vfmadd132ps_fma(*pauVar17,auVar204,auVar145);
                        auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar72,auVar123);
                        *pauVar17 = ZEXT1632(auVar113);
                        pauVar17 = pauVar17 + 1;
                        pauVar21 = (undefined1 (*) [32])(*pauVar21 + 8);
                        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 8);
                        iVar9 = iVar9 + 8;
                        uVar11 = uVar20 | 4;
                      } while (iVar9 <= (int)uVar20);
                    }
                    for (; (int)uVar11 <= (int)uVar20; uVar11 = uVar11 + 4) {
                      uVar1 = *(undefined4 *)*pauVar21;
                      auVar44._4_4_ = uVar1;
                      auVar44._0_4_ = uVar1;
                      auVar44._8_4_ = uVar1;
                      auVar44._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)*pauVar8;
                      auVar103._4_4_ = uVar1;
                      auVar103._0_4_ = uVar1;
                      auVar103._8_4_ = uVar1;
                      auVar103._12_4_ = uVar1;
                      auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar112,auVar139);
                      auVar113 = vfmadd213ps_fma(auVar113,auVar44,auVar103);
                      *(undefined1 (*) [16])*pauVar17 = auVar113;
                      pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                      pauVar21 = (undefined1 (*) [32])(*pauVar21 + 4);
                      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 4);
                    }
                  }
                  if (iVar10 == 1) {
                    auVar113 = vshufps_avx(auVar139,auVar139,0);
                    auVar179 = vshufps_avx(auVar112,auVar112,0);
                    uVar11 = 0;
                    if (7 < (int)uVar20) {
                      auVar73._16_16_ = auVar113;
                      auVar73._0_16_ = auVar113;
                      auVar124._16_16_ = auVar179;
                      auVar124._0_16_ = auVar179;
                      iVar9 = 8;
                      do {
                        auVar168 = vfmadd132ps_fma(*pauVar17,auVar124,auVar73);
                        auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),*pauVar21,*pauVar8);
                        *pauVar17 = ZEXT1632(auVar168);
                        pauVar17 = pauVar17 + 1;
                        pauVar21 = pauVar21 + 1;
                        pauVar8 = pauVar8 + 1;
                        iVar9 = iVar9 + 8;
                        uVar11 = uVar24;
                      } while (iVar9 <= (int)uVar20);
                    }
                    uVar18 = uVar11 | 4;
                    while ((int)uVar18 <= (int)uVar20) {
                      auVar168 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar179,auVar113);
                      auVar168 = vfmadd213ps_fma(auVar168,*(undefined1 (*) [16])*pauVar21,
                                                 *(undefined1 (*) [16])*pauVar8);
                      *(undefined1 (*) [16])*pauVar17 = auVar168;
                      pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                      pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
                      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
                      uVar18 = uVar11 + 8;
                      uVar11 = uVar11 + 4;
                    }
                    if (uVar20 - uVar11 != 0 && (int)uVar11 <= (int)uVar20) {
                      lVar13 = 0;
                      do {
                        auVar113 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar17 + lVar13 * 4)),
                                                   auVar112,auVar139);
                        auVar113 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar21 + lVar13 * 4)),
                                                   auVar113,ZEXT416(*(uint *)(*pauVar8 + lVar13 * 4)
                                                                   ));
                        *(int *)(*pauVar17 + lVar13 * 4) = auVar113._0_4_;
                        lVar13 = lVar13 + 1;
                      } while (uVar20 - uVar11 != (int)lVar13);
                    }
                  }
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar16);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar15);
        }
      }
      else if (0 < (int)uVar15) {
        pp_Var3 = this->_vptr_LayerNorm_x86_fma;
        uVar20 = uVar16 * iVar2 * iVar10;
        fVar26 = 1.0 / (float)(int)(uVar16 * iVar2);
        auVar141 = vshufps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),0);
        uVar16 = uVar20 & 0xfffffff8;
        uVar22 = 0;
        auVar175 = ZEXT3264(_DAT_0054d840);
        auVar255 = ZEXT3264(_DAT_0054d860);
        auVar178._8_8_ = 0x8000000000000000;
        auVar178._0_8_ = 0x8000000000000000;
        auVar139 = vpcmpeqd_avx(auVar112,auVar112);
        auVar184 = ZEXT1664(auVar139);
        do {
          pauVar17 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar22 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar190 = ZEXT832(0) << 0x40;
          pauVar8 = pauVar17;
          uVar24 = 0;
          if (7 < (int)uVar20) {
            iVar9 = 8;
            do {
              auVar190._0_4_ = auVar192._0_4_ + *(float *)*pauVar8;
              auVar190._4_4_ = auVar192._4_4_ + *(float *)(*pauVar8 + 4);
              auVar190._8_4_ = auVar192._8_4_ + *(float *)(*pauVar8 + 8);
              auVar190._12_4_ = auVar192._12_4_ + *(float *)(*pauVar8 + 0xc);
              auVar190._16_4_ = auVar192._16_4_ + *(float *)(*pauVar8 + 0x10);
              auVar190._20_4_ = auVar192._20_4_ + *(float *)(*pauVar8 + 0x14);
              auVar190._24_4_ = auVar192._24_4_ + *(float *)(*pauVar8 + 0x18);
              auVar190._28_4_ = auVar192._28_4_ + *(float *)(*pauVar8 + 0x1c);
              auVar192 = ZEXT3264(auVar190);
              pauVar8 = pauVar8 + 1;
              iVar9 = iVar9 + 8;
              uVar24 = uVar16;
            } while (iVar9 <= (int)uVar20);
          }
          uVar11 = uVar24 | 4;
          auVar201 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar27 = auVar201._4_4_;
            fVar207 = auVar201._8_4_;
            fVar88 = auVar201._12_4_;
            if ((int)uVar20 < (int)uVar11) break;
            auVar201._0_4_ = auVar201._0_4_ + *(float *)*pauVar8;
            auVar201._4_4_ = fVar27 + *(float *)(*pauVar8 + 4);
            auVar201._8_4_ = fVar207 + *(float *)(*pauVar8 + 8);
            auVar201._12_4_ = fVar88 + *(float *)(*pauVar8 + 0xc);
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
            uVar11 = uVar24 + 8;
            uVar24 = uVar24 + 4;
          }
          fVar89 = 0.0;
          auVar86 = auVar175._0_32_;
          auVar139 = auVar184._0_16_;
          if ((int)uVar24 < (int)uVar20) {
            uVar23 = CONCAT44(0,~uVar24 + uVar20);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar23;
            auVar179 = vpshufd_avx(auVar48,0x44);
            auVar112 = vorps_avx(auVar179,auVar178);
            auVar113 = vorps_avx(auVar179,auVar178);
            uVar12 = 0;
            auVar192 = ZEXT464(0) << 0x40;
            do {
              auVar193 = auVar192;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = uVar12;
              auVar168 = vpshufd_avx(auVar49,0x44);
              auVar77._16_16_ = auVar168;
              auVar77._0_16_ = auVar168;
              auVar222 = vorps_avx(auVar77,auVar86);
              auVar236 = vorps_avx(auVar255._0_32_,auVar77);
              auVar168 = vorps_avx(auVar179,auVar178);
              auVar50._8_4_ = auVar236._24_4_;
              auVar50._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
              auVar50._12_4_ = auVar236._28_4_ ^ 0x80000000;
              auVar167 = vpcmpgtq_avx(auVar50,auVar168);
              auVar105._8_4_ = auVar236._8_4_;
              auVar239._8_4_ = auVar105._8_4_;
              auVar239._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
              auVar239._12_4_ = auVar236._12_4_ ^ 0x80000000;
              auVar185 = vpcmpgtq_avx(auVar239,auVar112);
              auVar185 = vpackssdw_avx(auVar185,auVar167);
              auVar251._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
              auVar251._8_4_ = auVar222._24_4_;
              auVar251._12_4_ = auVar222._28_4_ ^ 0x80000000;
              auVar140 = vpcmpgtq_avx(auVar251,auVar168);
              auVar252._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
              auVar252._8_4_ = auVar222._8_4_;
              auVar252._12_4_ = auVar222._12_4_ ^ 0x80000000;
              auVar168 = vpcmpgtq_avx(auVar252,auVar113);
              auVar168 = vpackssdw_avx(auVar168,auVar140);
              auVar168 = vpackssdw_avx(auVar168 ^ auVar139,auVar185 ^ auVar139);
              auVar185 = vpmovsxwd_avx(auVar168);
              auVar168 = vpunpckhwd_avx(auVar168,auVar168);
              auVar245._16_16_ = auVar168;
              auVar245._0_16_ = auVar185;
              auVar151 = vmaskmovps_avx(auVar245,*(undefined1 (*) [32])(*pauVar8 + uVar12 * 4));
              auVar219._0_4_ = auVar151._0_4_ + auVar193._0_4_;
              auVar219._4_4_ = auVar151._4_4_ + auVar193._4_4_;
              auVar219._8_4_ = auVar151._8_4_ + auVar193._8_4_;
              auVar219._12_4_ = auVar151._12_4_ + auVar193._12_4_;
              auVar226._16_4_ = auVar151._16_4_ + auVar193._16_4_;
              auVar226._0_16_ = auVar219;
              auVar226._20_4_ = auVar151._20_4_ + auVar193._20_4_;
              auVar226._24_4_ = auVar151._24_4_ + auVar193._24_4_;
              auVar226._28_4_ = auVar151._28_4_ + auVar193._28_4_;
              uVar12 = uVar12 + 8;
              auVar192 = ZEXT3264(auVar226);
            } while ((uVar23 + 8 & 0x1fffffff8) != uVar12);
            auVar112 = vorps_avx(auVar179,auVar178);
            auVar105._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
            auVar105._12_4_ = auVar236._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar105,auVar112);
            auVar113 = vpackssdw_avx(auVar112,auVar167);
            auVar112 = vorps_avx(auVar179,auVar178);
            auVar137._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
            auVar137._8_4_ = auVar222._8_4_;
            auVar137._12_4_ = auVar222._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar137,auVar112);
            auVar112 = vpackssdw_avx(auVar112,auVar140);
            auVar112 = vblendvps_avx(auVar193._0_16_,auVar219,auVar112 ^ auVar139);
            auVar113 = vblendvps_avx(auVar193._16_16_,auVar226._16_16_,auVar113 ^ auVar139);
            auVar112 = vhaddps_avx(auVar113,auVar112);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            fVar89 = auVar112._0_4_;
          }
          local_78 = auVar141._0_4_;
          fStack_74 = auVar141._4_4_;
          fStack_70 = auVar141._8_4_;
          fStack_6c = auVar141._12_4_;
          if (iVar10 == 4) {
            auVar201._0_4_ = auVar201._0_4_ + auVar190._16_4_ + auVar190._0_4_;
            auVar201._4_4_ = fVar27 + auVar190._20_4_ + auVar190._4_4_;
            auVar201._8_4_ = fVar207 + auVar190._24_4_ + auVar190._8_4_;
            auVar201._12_4_ = fVar88 + auVar190._28_4_ + auVar190._12_4_;
            auVar192 = ZEXT1664(CONCAT412(auVar201._12_4_ * fStack_6c,
                                          CONCAT48(auVar201._8_4_ * fStack_70,
                                                   CONCAT44(auVar201._4_4_ * fStack_74,
                                                            auVar201._0_4_ * local_78))));
          }
          else {
            auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
            if (iVar10 == 8) {
              auVar192 = ZEXT2864(CONCAT424(auVar190._24_4_ * fStack_70,
                                            CONCAT420(auVar190._20_4_ * fStack_74,
                                                      CONCAT416(auVar190._16_4_ * local_78,
                                                                CONCAT412(auVar190._12_4_ *
                                                                          fStack_6c,
                                                                          CONCAT48(auVar190._8_4_ *
                                                                                   fStack_70,
                                                                                   CONCAT44(auVar190
                                                  ._4_4_ * fStack_74,auVar190._0_4_ * local_78))))))
                                 );
            }
          }
          if (iVar10 == 1) {
            auVar112 = vshufpd_avx(auVar201,auVar201,1);
            auVar106._0_4_ = auVar201._0_4_ + auVar112._0_4_;
            auVar106._4_4_ = auVar201._4_4_ + auVar112._4_4_;
            auVar106._8_4_ = auVar201._8_4_ + auVar112._8_4_;
            auVar106._12_4_ = auVar201._12_4_ + auVar112._12_4_;
            auVar112 = vhaddps_avx(auVar190._16_16_,auVar190._0_16_);
            auVar113 = vmovshdup_avx(auVar106);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            auVar222 = vblendps_avx(auVar192._0_32_,
                                    ZEXT432((uint)((auVar112._0_4_ + auVar106._0_4_ +
                                                   fVar89 + auVar113._0_4_) * fVar26)),1);
            auVar192 = ZEXT3264(auVar222);
          }
          auVar113 = auVar192._0_16_;
          auVar112 = auVar113;
          if (iVar10 != 4) {
            auVar112 = vshufps_avx(auVar113,auVar113,0);
          }
          auVar78 = auVar192._0_32_;
          if (iVar10 != 8) {
            auVar78._16_16_ = auVar112;
            auVar78._0_16_ = auVar112;
          }
          pauVar8 = pauVar17;
          if ((int)uVar20 < 8) {
            auVar222 = SUB6432(ZEXT864(0),0) << 0x20;
            uVar24 = 0;
          }
          else {
            auVar193 = ZEXT864(0) << 0x20;
            iVar9 = 8;
            do {
              auVar222 = vsubps_avx(*pauVar8,auVar78);
              auVar179 = vfmadd231ps_fma(auVar193._0_32_,auVar222,auVar222);
              auVar193 = ZEXT1664(auVar179);
              auVar222 = ZEXT1632(auVar179);
              pauVar8 = pauVar8 + 1;
              iVar9 = iVar9 + 8;
              uVar24 = uVar16;
            } while (iVar9 <= (int)uVar20);
          }
          auVar179 = ZEXT816(0) << 0x40;
          uVar11 = uVar24 | 4;
          while ((int)uVar11 <= (int)uVar20) {
            auVar168 = vsubps_avx(*(undefined1 (*) [16])*pauVar8,auVar112);
            auVar179 = vfmadd231ps_fma(auVar179,auVar168,auVar168);
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
            uVar11 = uVar24 + 8;
            uVar24 = uVar24 + 4;
          }
          fVar27 = 0.0;
          if ((int)uVar24 < (int)uVar20) {
            uVar23 = CONCAT44(0,~uVar24 + uVar20);
            auVar51._8_8_ = 0;
            auVar51._0_8_ = uVar23;
            auVar168 = vpshufd_avx(auVar51,0x44);
            auVar112 = vshufps_avx(auVar113,auVar113,0);
            auVar246._16_16_ = auVar112;
            auVar246._0_16_ = auVar112;
            auVar112 = vorps_avx(auVar168,auVar178);
            auVar113 = vorps_avx(auVar168,auVar178);
            uVar12 = 0;
            auVar139 = vpcmpeqd_avx(auVar139,auVar139);
            auVar185 = ZEXT416(0) << 0x40;
            do {
              auVar208 = auVar185;
              auVar107._8_8_ = 0;
              auVar107._0_8_ = uVar12;
              auVar185 = vpshufd_avx(auVar107,0x44);
              auVar126._16_16_ = auVar185;
              auVar126._0_16_ = auVar185;
              auVar236 = vorps_avx(auVar86,auVar126);
              auVar151 = vorps_avx(auVar126,_DAT_0054d860);
              auVar185 = vorps_avx(auVar168,auVar178);
              auVar202._0_8_ = auVar151._16_8_ ^ 0x8000000000000000;
              auVar202._8_4_ = auVar151._24_4_;
              auVar202._12_4_ = auVar151._28_4_ ^ 0x80000000;
              auVar140 = vpcmpgtq_avx(auVar202,auVar185);
              auVar235._0_8_ = auVar151._0_8_ ^ 0x8000000000000000;
              auVar108._8_4_ = auVar151._8_4_;
              auVar235._8_4_ = auVar108._8_4_;
              auVar235._12_4_ = auVar151._12_4_ ^ 0x80000000;
              auVar167 = vpcmpgtq_avx(auVar235,auVar112);
              auVar167 = vpackssdw_avx(auVar167,auVar140);
              auVar162._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
              auVar162._8_4_ = auVar236._24_4_;
              auVar162._12_4_ = auVar236._28_4_ ^ 0x80000000;
              auVar149 = vpcmpgtq_avx(auVar162,auVar185);
              auVar163._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
              auVar163._8_4_ = auVar236._8_4_;
              auVar163._12_4_ = auVar236._12_4_ ^ 0x80000000;
              auVar185 = vpcmpgtq_avx(auVar163,auVar113);
              auVar185 = vpackssdw_avx(auVar185,auVar149);
              auVar185 = vpackssdw_avx(auVar185 ^ auVar139,auVar167 ^ auVar139);
              auVar167 = vpmovsxwd_avx(auVar185);
              auVar185 = vpunpckhwd_avx(auVar185,auVar185);
              auVar173._16_16_ = auVar185;
              auVar173._0_16_ = auVar167;
              auVar148 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])(*pauVar8 + uVar12 * 4));
              auVar148 = vsubps_avx(auVar148,auVar246);
              auVar185 = vfmadd213ps_fma(auVar148,auVar148,ZEXT1632(auVar208));
              uVar12 = uVar12 + 8;
            } while ((uVar23 + 8 & 0x1fffffff8) != uVar12);
            auVar112 = vorps_avx(auVar168,auVar178);
            auVar108._0_8_ = auVar151._0_8_ ^ 0x8000000000000000;
            auVar108._12_4_ = auVar151._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar108,auVar112);
            auVar113 = vpackssdw_avx(auVar112,auVar140);
            auVar112 = vorps_avx(auVar168,auVar178);
            auVar164._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
            auVar164._8_4_ = auVar236._8_4_;
            auVar164._12_4_ = auVar236._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar164,auVar112);
            auVar112 = vpackssdw_avx(auVar112,auVar149);
            auVar112 = vblendvps_avx(auVar208,auVar185,auVar112 ^ auVar139);
            auVar113 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar113 ^ auVar139
                                    );
            auVar112 = vhaddps_avx(auVar113,auVar112);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            fVar27 = auVar112._0_4_;
            auVar175 = ZEXT3264(auVar86);
            auVar255 = ZEXT3264(_DAT_0054d860);
            auVar139 = vpcmpeqd_avx(auVar139,auVar139);
            auVar184 = ZEXT1664(auVar139);
            auVar192 = ZEXT3264(auVar192._0_32_);
          }
          auVar139 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]));
          auVar83 = auVar192._0_32_;
          auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
          if (iVar10 == 8) {
            auVar193 = ZEXT2864(CONCAT424(auVar222._24_4_ * fStack_70,
                                          CONCAT420(auVar222._20_4_ * fStack_74,
                                                    CONCAT416(auVar222._16_4_ * local_78,
                                                              CONCAT412(auVar222._12_4_ * fStack_6c,
                                                                        CONCAT48(auVar222._8_4_ *
                                                                                 fStack_70,
                                                                                 CONCAT44(auVar222.
                                                  _4_4_ * fStack_74,auVar222._0_4_ * local_78)))))))
            ;
          }
          auVar230 = auVar179;
          if (iVar10 == 4) {
            auVar230._0_4_ = auVar179._0_4_ + auVar222._0_4_ + auVar222._16_4_;
            auVar230._4_4_ = auVar179._4_4_ + auVar222._4_4_ + auVar222._20_4_;
            auVar230._8_4_ = auVar179._8_4_ + auVar222._8_4_ + auVar222._24_4_;
            auVar230._12_4_ = auVar179._12_4_ + auVar222._12_4_ + auVar222._28_4_;
            auVar86 = vblendps_avx(auVar193._0_32_,
                                   ZEXT1632(CONCAT412(auVar230._12_4_ * fStack_6c,
                                                      CONCAT48(auVar230._8_4_ * fStack_70,
                                                               CONCAT44(auVar230._4_4_ * fStack_74,
                                                                        auVar230._0_4_ * local_78)))
                                           ),0xf);
            auVar193 = ZEXT3264(auVar86);
          }
          if (iVar10 == 1) {
            auVar112 = vshufpd_avx(auVar230,auVar230,1);
            auVar109._0_4_ = auVar230._0_4_ + auVar112._0_4_;
            auVar109._4_4_ = auVar230._4_4_ + auVar112._4_4_;
            auVar109._8_4_ = auVar230._8_4_ + auVar112._8_4_;
            auVar109._12_4_ = auVar230._12_4_ + auVar112._12_4_;
            auVar112 = vhaddps_avx(auVar222._16_16_,auVar222._0_16_);
            auVar113 = vmovshdup_avx(auVar109);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            auVar112 = vhaddps_avx(auVar112,auVar112);
            auVar86 = vblendps_avx(auVar193._0_32_,
                                   ZEXT432((uint)((fVar27 + auVar112._0_4_ + auVar113._0_4_ +
                                                  auVar109._0_4_) * fVar26)),1);
            auVar193 = ZEXT3264(auVar86);
          }
          fVar27 = auVar193._0_4_;
          auVar130 = auVar193._0_32_;
          fVar207 = auVar192._0_4_;
          if (iVar10 == 1) {
            fVar27 = fVar27 + *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
            auVar139 = vrsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
            auVar112 = vfmadd213ss_fma(ZEXT416((uint)(fVar27 * auVar139._0_4_)),auVar139,
                                       ZEXT416(0xc0400000));
            fVar27 = auVar139._0_4_ * -0.5 * auVar112._0_4_;
            auVar130 = vblendps_avx(auVar130,ZEXT432((uint)fVar27),1);
            auVar83 = vblendps_avx(auVar83,ZEXT432((uint)(fVar27 * -fVar207)),1);
          }
          else if (iVar10 == 4) {
            auVar139 = vshufps_avx(auVar139,auVar139,0);
            auVar52._0_4_ = fVar27 + auVar139._0_4_;
            auVar52._4_4_ = auVar193._4_4_ + auVar139._4_4_;
            auVar52._8_4_ = auVar193._8_4_ + auVar139._8_4_;
            auVar52._12_4_ = auVar193._12_4_ + auVar139._12_4_;
            auVar139 = vrsqrtps_avx(auVar52);
            auVar53._0_4_ = auVar52._0_4_ * auVar139._0_4_;
            auVar53._4_4_ = auVar52._4_4_ * auVar139._4_4_;
            auVar53._8_4_ = auVar52._8_4_ * auVar139._8_4_;
            auVar53._12_4_ = auVar52._12_4_ * auVar139._12_4_;
            auVar138._8_4_ = 0xc0400000;
            auVar138._0_8_ = 0xc0400000c0400000;
            auVar138._12_4_ = 0xc0400000;
            auVar112 = vfmadd213ps_fma(auVar53,auVar139,auVar138);
            fVar27 = auVar139._0_4_ * -0.5 * auVar112._0_4_;
            fVar88 = auVar139._4_4_ * -0.5 * auVar112._4_4_;
            fVar89 = auVar139._8_4_ * -0.5 * auVar112._8_4_;
            fVar90 = auVar139._12_4_ * -0.5 * auVar112._12_4_;
            auVar130 = vblendps_avx(auVar130,ZEXT1632(CONCAT412(fVar90,CONCAT48(fVar89,CONCAT44(
                                                  fVar88,fVar27)))),0xf);
            auVar83 = vblendps_avx(auVar83,ZEXT1632(CONCAT412(fVar90 * -auVar192._12_4_,
                                                              CONCAT48(fVar89 * -auVar192._8_4_,
                                                                       CONCAT44(fVar88 * -auVar192.
                                                  _4_4_,fVar27 * -fVar207)))),0xf);
          }
          else if (iVar10 == 8) {
            auVar139 = vshufps_avx(auVar139,auVar139,0);
            auVar79._0_4_ = fVar27 + auVar139._0_4_;
            auVar79._4_4_ = auVar193._4_4_ + auVar139._4_4_;
            auVar79._8_4_ = auVar193._8_4_ + auVar139._8_4_;
            auVar79._12_4_ = auVar193._12_4_ + auVar139._12_4_;
            auVar79._16_4_ = auVar193._16_4_ + auVar139._0_4_;
            auVar79._20_4_ = auVar193._20_4_ + auVar139._4_4_;
            auVar79._24_4_ = auVar193._24_4_ + auVar139._8_4_;
            auVar79._28_4_ = auVar193._28_4_ + auVar139._12_4_;
            auVar86 = vrsqrtps_avx(auVar79);
            auVar7._4_4_ = auVar79._4_4_ * auVar86._4_4_;
            auVar7._0_4_ = auVar79._0_4_ * auVar86._0_4_;
            auVar7._8_4_ = auVar79._8_4_ * auVar86._8_4_;
            auVar7._12_4_ = auVar79._12_4_ * auVar86._12_4_;
            auVar7._16_4_ = auVar79._16_4_ * auVar86._16_4_;
            auVar7._20_4_ = auVar79._20_4_ * auVar86._20_4_;
            auVar7._24_4_ = auVar79._24_4_ * auVar86._24_4_;
            auVar7._28_4_ = auVar79._28_4_;
            auVar146._8_4_ = 0xc0400000;
            auVar146._0_8_ = 0xc0400000c0400000;
            auVar146._12_4_ = 0xc0400000;
            auVar146._16_4_ = 0xc0400000;
            auVar146._20_4_ = 0xc0400000;
            auVar146._24_4_ = 0xc0400000;
            auVar146._28_4_ = 0xc0400000;
            auVar139 = vfmadd213ps_fma(auVar7,auVar86,auVar146);
            auVar196._0_4_ = auVar86._0_4_ * -0.5 * auVar139._0_4_;
            auVar196._4_4_ = auVar86._4_4_ * -0.5 * auVar139._4_4_;
            auVar196._8_4_ = auVar86._8_4_ * -0.5 * auVar139._8_4_;
            auVar196._12_4_ = auVar86._12_4_ * -0.5 * auVar139._12_4_;
            auVar196._16_4_ = auVar86._16_4_ * -0.5 * 0.0;
            auVar196._20_4_ = auVar86._20_4_ * -0.5 * 0.0;
            auVar196._28_36_ = auVar193._28_36_;
            auVar196._24_4_ = auVar86._24_4_ * -0.5 * 0.0;
            auVar130 = auVar196._0_32_;
            auVar216._0_4_ = auVar196._0_4_ * -fVar207;
            auVar216._4_4_ = auVar196._4_4_ * -auVar192._4_4_;
            auVar216._8_4_ = auVar196._8_4_ * -auVar192._8_4_;
            auVar216._12_4_ = auVar196._12_4_ * -auVar192._12_4_;
            auVar216._16_4_ = auVar196._16_4_ * -auVar192._16_4_;
            auVar216._20_4_ = auVar196._20_4_ * -auVar192._20_4_;
            auVar216._28_36_ = auVar192._28_36_;
            auVar216._24_4_ = auVar196._24_4_ * -auVar192._24_4_;
            auVar83 = auVar216._0_32_;
          }
          auVar139 = auVar130._0_16_;
          auVar112 = auVar83._0_16_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
            auVar179 = auVar112;
            auVar113 = auVar139;
            if (iVar10 != 4) {
              auVar113 = vshufps_avx(auVar139,auVar139,0);
              auVar179 = vshufps_avx(auVar112,auVar112,0);
            }
            if (iVar10 != 8) {
              auVar130._16_16_ = auVar113;
              auVar130._0_16_ = auVar113;
              auVar83._16_16_ = auVar179;
              auVar83._0_16_ = auVar179;
            }
            uVar24 = 0;
            if (7 < (int)uVar20) {
              iVar9 = 8;
              do {
                auVar168 = vfmadd132ps_fma(*pauVar17,auVar83,auVar130);
                *pauVar17 = ZEXT1632(auVar168);
                pauVar17 = pauVar17 + 1;
                iVar9 = iVar9 + 8;
                uVar24 = uVar16;
              } while (iVar9 <= (int)uVar20);
            }
            uVar11 = uVar24 | 4;
            while ((int)uVar11 <= (int)uVar20) {
              auVar168 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar179,auVar113);
              *(undefined1 (*) [16])*pauVar17 = auVar168;
              pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
              uVar11 = uVar24 + 8;
              uVar24 = uVar24 + 4;
            }
            if ((int)uVar24 < (int)uVar20) {
              uVar23 = CONCAT44(0,~uVar24 + uVar20);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar23;
              auVar113 = vpshufd_avx(auVar55,0x44);
              auVar139 = vshufps_avx(auVar139,auVar139,0);
              auVar191._16_16_ = auVar139;
              auVar191._0_16_ = auVar139;
              auVar139 = vshufps_avx(auVar112,auVar112,0);
              auVar227._16_16_ = auVar139;
              auVar227._0_16_ = auVar139;
              auVar139 = vorps_avx(auVar113,auVar178);
              auVar112 = vorps_avx(auVar113,auVar178);
              uVar12 = 0;
              do {
                auVar56._8_8_ = 0;
                auVar56._0_8_ = uVar12;
                auVar179 = vpshufd_avx(auVar56,0x44);
                auVar84._16_16_ = auVar179;
                auVar84._0_16_ = auVar179;
                auVar86 = vorps_avx(auVar84,auVar175._0_32_);
                auVar222 = vorps_avx(auVar255._0_32_,auVar84);
                auVar179 = vorps_avx(auVar113,auVar178);
                auVar165._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
                auVar165._8_4_ = auVar222._24_4_;
                auVar165._12_4_ = auVar222._28_4_ ^ 0x80000000;
                auVar168 = vpcmpgtq_avx(auVar165,auVar179);
                auVar57._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
                auVar57._8_4_ = auVar222._8_4_;
                auVar57._12_4_ = auVar222._12_4_ ^ 0x80000000;
                auVar185 = vpcmpgtq_avx(auVar57,auVar139);
                auVar168 = vpackssdw_avx(auVar185,auVar168);
                auVar166._0_8_ = auVar86._16_8_ ^ 0x8000000000000000;
                auVar166._8_4_ = auVar86._24_4_;
                auVar166._12_4_ = auVar86._28_4_ ^ 0x80000000;
                auVar179 = vpcmpgtq_avx(auVar166,auVar179);
                auVar175 = ZEXT3264(auVar175._0_32_);
                auVar111._0_8_ = auVar86._0_8_ ^ 0x8000000000000000;
                auVar111._8_4_ = auVar86._8_4_;
                auVar111._12_4_ = auVar86._12_4_ ^ 0x80000000;
                auVar185 = vpcmpgtq_avx(auVar111,auVar112);
                auVar179 = vpackssdw_avx(auVar185,auVar179);
                auVar179 = vpackssdw_avx(auVar179 ^ auVar184._0_16_,auVar168 ^ auVar184._0_16_);
                auVar168 = vpmovsxwd_avx(auVar179);
                auVar179 = vpunpckhwd_avx(auVar179,auVar179);
                auVar85._16_16_ = auVar179;
                auVar85._0_16_ = auVar168;
                auVar86 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])(*pauVar17 + uVar12 * 4));
                auVar179 = vfmadd213ps_fma(auVar86,auVar191,auVar227);
                auVar86 = vmaskmovps_avx(auVar85,ZEXT1632(auVar179));
                *(undefined1 (*) [32])(*pauVar17 + uVar12 * 4) = auVar86;
                uVar12 = uVar12 + 8;
              } while ((uVar23 + 8 & 0x1fffffff8) != uVar12);
            }
          }
          else {
            pauVar8 = pauVar25;
            pauVar21 = pauVar14;
            if (7 < (int)uVar20 && iVar10 == 8) {
              iVar9 = 8;
              do {
                uVar1 = *(undefined4 *)*pauVar21;
                auVar80._4_4_ = uVar1;
                auVar80._0_4_ = uVar1;
                auVar80._8_4_ = uVar1;
                auVar80._12_4_ = uVar1;
                auVar80._16_4_ = uVar1;
                auVar80._20_4_ = uVar1;
                auVar80._24_4_ = uVar1;
                auVar80._28_4_ = uVar1;
                uVar1 = *(undefined4 *)*pauVar8;
                auVar127._4_4_ = uVar1;
                auVar127._0_4_ = uVar1;
                auVar127._8_4_ = uVar1;
                auVar127._12_4_ = uVar1;
                auVar127._16_4_ = uVar1;
                auVar127._20_4_ = uVar1;
                auVar127._24_4_ = uVar1;
                auVar127._28_4_ = uVar1;
                auVar113 = vfmadd132ps_fma(*pauVar17,auVar83,auVar130);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar80,auVar127);
                *pauVar17 = ZEXT1632(auVar113);
                pauVar17 = pauVar17 + 1;
                pauVar21 = (undefined1 (*) [32])(*pauVar21 + 4);
                pauVar8 = (undefined1 (*) [32])(*pauVar8 + 4);
                iVar9 = iVar9 + 8;
              } while (iVar9 <= (int)uVar20);
            }
            if (iVar10 == 4) {
              uVar24 = 4;
              if (7 < (int)uVar20) {
                auVar147._16_16_ = auVar139;
                auVar147._0_16_ = auVar139;
                auVar205._16_16_ = auVar112;
                auVar205._0_16_ = auVar112;
                iVar9 = 8;
                do {
                  uVar1 = *(undefined4 *)*pauVar21;
                  auVar81._4_4_ = uVar1;
                  auVar81._0_4_ = uVar1;
                  auVar81._8_4_ = uVar1;
                  auVar81._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(*pauVar21 + 4);
                  auVar81._20_4_ = uVar1;
                  auVar81._16_4_ = uVar1;
                  auVar81._24_4_ = uVar1;
                  auVar81._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)*pauVar8;
                  auVar128._4_4_ = uVar1;
                  auVar128._0_4_ = uVar1;
                  auVar128._8_4_ = uVar1;
                  auVar128._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(*pauVar8 + 4);
                  auVar128._20_4_ = uVar1;
                  auVar128._16_4_ = uVar1;
                  auVar128._24_4_ = uVar1;
                  auVar128._28_4_ = uVar1;
                  auVar113 = vfmadd132ps_fma(*pauVar17,auVar205,auVar147);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar128);
                  *pauVar17 = ZEXT1632(auVar113);
                  pauVar17 = pauVar17 + 1;
                  pauVar21 = (undefined1 (*) [32])(*pauVar21 + 8);
                  pauVar8 = (undefined1 (*) [32])(*pauVar8 + 8);
                  iVar9 = iVar9 + 8;
                  uVar24 = uVar20 | 4;
                } while (iVar9 <= (int)uVar20);
              }
              for (; (int)uVar24 <= (int)uVar20; uVar24 = uVar24 + 4) {
                uVar1 = *(undefined4 *)*pauVar21;
                auVar54._4_4_ = uVar1;
                auVar54._0_4_ = uVar1;
                auVar54._8_4_ = uVar1;
                auVar54._12_4_ = uVar1;
                uVar1 = *(undefined4 *)*pauVar8;
                auVar110._4_4_ = uVar1;
                auVar110._0_4_ = uVar1;
                auVar110._8_4_ = uVar1;
                auVar110._12_4_ = uVar1;
                auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar112,auVar139);
                auVar113 = vfmadd213ps_fma(auVar113,auVar54,auVar110);
                *(undefined1 (*) [16])*pauVar17 = auVar113;
                pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                pauVar21 = (undefined1 (*) [32])(*pauVar21 + 4);
                pauVar8 = (undefined1 (*) [32])(*pauVar8 + 4);
              }
            }
            if (iVar10 == 1) {
              auVar113 = vshufps_avx(auVar139,auVar139,0);
              auVar179 = vshufps_avx(auVar112,auVar112,0);
              uVar24 = 0;
              if (7 < (int)uVar20) {
                auVar82._16_16_ = auVar113;
                auVar82._0_16_ = auVar113;
                auVar129._16_16_ = auVar179;
                auVar129._0_16_ = auVar179;
                iVar9 = 8;
                do {
                  auVar168 = vfmadd132ps_fma(*pauVar17,auVar129,auVar82);
                  auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),*pauVar21,*pauVar8);
                  *pauVar17 = ZEXT1632(auVar168);
                  pauVar17 = pauVar17 + 1;
                  pauVar21 = pauVar21 + 1;
                  pauVar8 = pauVar8 + 1;
                  iVar9 = iVar9 + 8;
                  uVar24 = uVar16;
                } while (iVar9 <= (int)uVar20);
              }
              uVar11 = uVar24 | 4;
              while ((int)uVar11 <= (int)uVar20) {
                auVar168 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar179,auVar113);
                auVar168 = vfmadd213ps_fma(auVar168,*(undefined1 (*) [16])*pauVar21,
                                           *(undefined1 (*) [16])*pauVar8);
                *(undefined1 (*) [16])*pauVar17 = auVar168;
                pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
                pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
                uVar11 = uVar24 + 8;
                uVar24 = uVar24 + 4;
              }
              if (uVar20 - uVar24 != 0 && (int)uVar24 <= (int)uVar20) {
                lVar13 = 0;
                do {
                  auVar113 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar17 + lVar13 * 4)),auVar112,
                                             auVar139);
                  auVar113 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar21 + lVar13 * 4)),auVar113,
                                             ZEXT416(*(uint *)(*pauVar8 + lVar13 * 4)));
                  *(int *)(*pauVar17 + lVar13 * 4) = auVar113._0_4_;
                  lVar13 = lVar13 + 1;
                } while (uVar20 - uVar24 != (int)lVar13);
              }
            }
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar15);
      }
    }
    else if ((iVar9 == 2) && (0 < (int)uVar16)) {
      uVar15 = iVar2 * iVar10;
      fVar26 = 1.0 / (float)iVar2;
      auVar141 = vshufps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),0);
      uVar20 = uVar15 & 0xfffffff8;
      uVar22 = 0;
      auVar175 = ZEXT3264(_DAT_0054d840);
      auVar255 = ZEXT3264(_DAT_0054d860);
      auVar176._8_8_ = 0x8000000000000000;
      auVar176._0_8_ = 0x8000000000000000;
      auVar139 = vpcmpeqd_avx(auVar112,auVar112);
      auVar184 = ZEXT1664(auVar139);
      do {
        pauVar17 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar186 = ZEXT832(0) << 0x40;
        pauVar8 = pauVar17;
        uVar24 = 0;
        if (7 < (int)uVar15) {
          iVar9 = 8;
          do {
            auVar186._0_4_ = auVar192._0_4_ + *(float *)*pauVar8;
            auVar186._4_4_ = auVar192._4_4_ + *(float *)(*pauVar8 + 4);
            auVar186._8_4_ = auVar192._8_4_ + *(float *)(*pauVar8 + 8);
            auVar186._12_4_ = auVar192._12_4_ + *(float *)(*pauVar8 + 0xc);
            auVar186._16_4_ = auVar192._16_4_ + *(float *)(*pauVar8 + 0x10);
            auVar186._20_4_ = auVar192._20_4_ + *(float *)(*pauVar8 + 0x14);
            auVar186._24_4_ = auVar192._24_4_ + *(float *)(*pauVar8 + 0x18);
            auVar186._28_4_ = auVar192._28_4_ + *(float *)(*pauVar8 + 0x1c);
            auVar192 = ZEXT3264(auVar186);
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 8;
            uVar24 = uVar20;
          } while (iVar9 <= (int)uVar15);
        }
        uVar11 = uVar24 | 4;
        auVar197 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar27 = auVar197._4_4_;
          fVar207 = auVar197._8_4_;
          fVar88 = auVar197._12_4_;
          if ((int)uVar15 < (int)uVar11) break;
          auVar197._0_4_ = auVar197._0_4_ + *(float *)*pauVar8;
          auVar197._4_4_ = fVar27 + *(float *)(*pauVar8 + 4);
          auVar197._8_4_ = fVar207 + *(float *)(*pauVar8 + 8);
          auVar197._12_4_ = fVar88 + *(float *)(*pauVar8 + 0xc);
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
          uVar11 = uVar24 + 8;
          uVar24 = uVar24 + 4;
        }
        fVar89 = 0.0;
        auVar86 = auVar175._0_32_;
        auVar139 = auVar184._0_16_;
        if ((int)uVar24 < (int)uVar15) {
          uVar23 = CONCAT44(0,~uVar24 + uVar15);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar23;
          auVar179 = vpshufd_avx(auVar28,0x44);
          auVar112 = vorps_avx(auVar179,auVar176);
          auVar113 = vorps_avx(auVar179,auVar176);
          uVar12 = 0;
          auVar192 = ZEXT464(0) << 0x40;
          do {
            auVar193 = auVar192;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar12;
            auVar168 = vpshufd_avx(auVar29,0x44);
            auVar59._16_16_ = auVar168;
            auVar59._0_16_ = auVar168;
            auVar222 = vorps_avx(auVar59,auVar86);
            auVar236 = vorps_avx(auVar255._0_32_,auVar59);
            auVar168 = vorps_avx(auVar179,auVar176);
            auVar30._8_4_ = auVar236._24_4_;
            auVar30._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
            auVar30._12_4_ = auVar236._28_4_ ^ 0x80000000;
            auVar167 = vpcmpgtq_avx(auVar30,auVar168);
            auVar91._8_4_ = auVar236._8_4_;
            auVar237._8_4_ = auVar91._8_4_;
            auVar237._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
            auVar237._12_4_ = auVar236._12_4_ ^ 0x80000000;
            auVar185 = vpcmpgtq_avx(auVar237,auVar112);
            auVar185 = vpackssdw_avx(auVar185,auVar167);
            auVar247._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
            auVar247._8_4_ = auVar222._24_4_;
            auVar247._12_4_ = auVar222._28_4_ ^ 0x80000000;
            auVar140 = vpcmpgtq_avx(auVar247,auVar168);
            auVar248._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
            auVar248._8_4_ = auVar222._8_4_;
            auVar248._12_4_ = auVar222._12_4_ ^ 0x80000000;
            auVar168 = vpcmpgtq_avx(auVar248,auVar113);
            auVar168 = vpackssdw_avx(auVar168,auVar140);
            auVar168 = vpackssdw_avx(auVar168 ^ auVar139,auVar185 ^ auVar139);
            auVar185 = vpmovsxwd_avx(auVar168);
            auVar168 = vpunpckhwd_avx(auVar168,auVar168);
            auVar241._16_16_ = auVar168;
            auVar241._0_16_ = auVar185;
            auVar151 = vmaskmovps_avx(auVar241,*(undefined1 (*) [32])(*pauVar8 + uVar12 * 4));
            auVar217._0_4_ = auVar151._0_4_ + auVar193._0_4_;
            auVar217._4_4_ = auVar151._4_4_ + auVar193._4_4_;
            auVar217._8_4_ = auVar151._8_4_ + auVar193._8_4_;
            auVar217._12_4_ = auVar151._12_4_ + auVar193._12_4_;
            auVar221._16_4_ = auVar151._16_4_ + auVar193._16_4_;
            auVar221._0_16_ = auVar217;
            auVar221._20_4_ = auVar151._20_4_ + auVar193._20_4_;
            auVar221._24_4_ = auVar151._24_4_ + auVar193._24_4_;
            auVar221._28_4_ = auVar151._28_4_ + auVar193._28_4_;
            uVar12 = uVar12 + 8;
            auVar192 = ZEXT3264(auVar221);
          } while ((uVar23 + 8 & 0x1fffffff8) != uVar12);
          auVar112 = vorps_avx(auVar179,auVar176);
          auVar91._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
          auVar91._12_4_ = auVar236._12_4_ ^ 0x80000000;
          auVar112 = vpcmpgtq_avx(auVar91,auVar112);
          auVar113 = vpackssdw_avx(auVar112,auVar167);
          auVar112 = vorps_avx(auVar179,auVar176);
          auVar133._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
          auVar133._8_4_ = auVar222._8_4_;
          auVar133._12_4_ = auVar222._12_4_ ^ 0x80000000;
          auVar112 = vpcmpgtq_avx(auVar133,auVar112);
          auVar112 = vpackssdw_avx(auVar112,auVar140);
          auVar112 = vblendvps_avx(auVar193._0_16_,auVar217,auVar112 ^ auVar139);
          auVar113 = vblendvps_avx(auVar193._16_16_,auVar221._16_16_,auVar113 ^ auVar139);
          auVar112 = vhaddps_avx(auVar113,auVar112);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          fVar89 = auVar112._0_4_;
        }
        local_78 = auVar141._0_4_;
        fStack_74 = auVar141._4_4_;
        fStack_70 = auVar141._8_4_;
        fStack_6c = auVar141._12_4_;
        if (iVar10 == 4) {
          auVar197._0_4_ = auVar197._0_4_ + auVar186._16_4_ + auVar186._0_4_;
          auVar197._4_4_ = fVar27 + auVar186._20_4_ + auVar186._4_4_;
          auVar197._8_4_ = fVar207 + auVar186._24_4_ + auVar186._8_4_;
          auVar197._12_4_ = fVar88 + auVar186._28_4_ + auVar186._12_4_;
          auVar192 = ZEXT1664(CONCAT412(auVar197._12_4_ * fStack_6c,
                                        CONCAT48(auVar197._8_4_ * fStack_70,
                                                 CONCAT44(auVar197._4_4_ * fStack_74,
                                                          auVar197._0_4_ * local_78))));
        }
        else {
          auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
          if (iVar10 == 8) {
            auVar192 = ZEXT2864(CONCAT424(auVar186._24_4_ * fStack_70,
                                          CONCAT420(auVar186._20_4_ * fStack_74,
                                                    CONCAT416(auVar186._16_4_ * local_78,
                                                              CONCAT412(auVar186._12_4_ * fStack_6c,
                                                                        CONCAT48(auVar186._8_4_ *
                                                                                 fStack_70,
                                                                                 CONCAT44(auVar186.
                                                  _4_4_ * fStack_74,auVar186._0_4_ * local_78)))))))
            ;
          }
        }
        if (iVar10 == 1) {
          auVar112 = vshufpd_avx(auVar197,auVar197,1);
          auVar92._0_4_ = auVar197._0_4_ + auVar112._0_4_;
          auVar92._4_4_ = auVar197._4_4_ + auVar112._4_4_;
          auVar92._8_4_ = auVar197._8_4_ + auVar112._8_4_;
          auVar92._12_4_ = auVar197._12_4_ + auVar112._12_4_;
          auVar112 = vhaddps_avx(auVar186._16_16_,auVar186._0_16_);
          auVar113 = vmovshdup_avx(auVar92);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          auVar222 = vblendps_avx(auVar192._0_32_,
                                  ZEXT432((uint)((auVar112._0_4_ + auVar92._0_4_ +
                                                 fVar89 + auVar113._0_4_) * fVar26)),1);
          auVar192 = ZEXT3264(auVar222);
        }
        auVar113 = auVar192._0_16_;
        auVar112 = auVar113;
        if (iVar10 != 4) {
          auVar112 = vshufps_avx(auVar113,auVar113,0);
        }
        auVar60 = auVar192._0_32_;
        if (iVar10 != 8) {
          auVar60._16_16_ = auVar112;
          auVar60._0_16_ = auVar112;
        }
        pauVar8 = pauVar17;
        if ((int)uVar15 < 8) {
          auVar222 = SUB6432(ZEXT864(0),0) << 0x20;
          uVar24 = 0;
        }
        else {
          auVar193 = ZEXT864(0) << 0x20;
          iVar9 = 8;
          do {
            auVar222 = vsubps_avx(*pauVar8,auVar60);
            auVar179 = vfmadd231ps_fma(auVar193._0_32_,auVar222,auVar222);
            auVar193 = ZEXT1664(auVar179);
            auVar222 = ZEXT1632(auVar179);
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 8;
            uVar24 = uVar20;
          } while (iVar9 <= (int)uVar15);
        }
        auVar179 = ZEXT816(0) << 0x40;
        uVar11 = uVar24 | 4;
        while ((int)uVar11 <= (int)uVar15) {
          auVar168 = vsubps_avx(*(undefined1 (*) [16])*pauVar8,auVar112);
          auVar179 = vfmadd231ps_fma(auVar179,auVar168,auVar168);
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
          uVar11 = uVar24 + 8;
          uVar24 = uVar24 + 4;
        }
        fVar27 = 0.0;
        if ((int)uVar24 < (int)uVar15) {
          uVar23 = CONCAT44(0,~uVar24 + uVar15);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar23;
          auVar168 = vpshufd_avx(auVar31,0x44);
          auVar112 = vshufps_avx(auVar113,auVar113,0);
          auVar242._16_16_ = auVar112;
          auVar242._0_16_ = auVar112;
          auVar112 = vorps_avx(auVar168,auVar176);
          auVar113 = vorps_avx(auVar168,auVar176);
          uVar12 = 0;
          auVar139 = vpcmpeqd_avx(auVar139,auVar139);
          auVar185 = ZEXT416(0) << 0x40;
          do {
            auVar208 = auVar185;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = uVar12;
            auVar185 = vpshufd_avx(auVar93,0x44);
            auVar116._16_16_ = auVar185;
            auVar116._0_16_ = auVar185;
            auVar236 = vorps_avx(auVar86,auVar116);
            auVar151 = vorps_avx(auVar116,_DAT_0054d860);
            auVar185 = vorps_avx(auVar168,auVar176);
            auVar198._0_8_ = auVar151._16_8_ ^ 0x8000000000000000;
            auVar198._8_4_ = auVar151._24_4_;
            auVar198._12_4_ = auVar151._28_4_ ^ 0x80000000;
            auVar140 = vpcmpgtq_avx(auVar198,auVar185);
            auVar233._0_8_ = auVar151._0_8_ ^ 0x8000000000000000;
            auVar94._8_4_ = auVar151._8_4_;
            auVar233._8_4_ = auVar94._8_4_;
            auVar233._12_4_ = auVar151._12_4_ ^ 0x80000000;
            auVar167 = vpcmpgtq_avx(auVar233,auVar112);
            auVar167 = vpackssdw_avx(auVar167,auVar140);
            auVar152._0_8_ = auVar236._16_8_ ^ 0x8000000000000000;
            auVar152._8_4_ = auVar236._24_4_;
            auVar152._12_4_ = auVar236._28_4_ ^ 0x80000000;
            auVar149 = vpcmpgtq_avx(auVar152,auVar185);
            auVar153._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
            auVar153._8_4_ = auVar236._8_4_;
            auVar153._12_4_ = auVar236._12_4_ ^ 0x80000000;
            auVar185 = vpcmpgtq_avx(auVar153,auVar113);
            auVar185 = vpackssdw_avx(auVar185,auVar149);
            auVar185 = vpackssdw_avx(auVar185 ^ auVar139,auVar167 ^ auVar139);
            auVar167 = vpmovsxwd_avx(auVar185);
            auVar185 = vpunpckhwd_avx(auVar185,auVar185);
            auVar171._16_16_ = auVar185;
            auVar171._0_16_ = auVar167;
            auVar148 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(*pauVar8 + uVar12 * 4));
            auVar148 = vsubps_avx(auVar148,auVar242);
            auVar185 = vfmadd213ps_fma(auVar148,auVar148,ZEXT1632(auVar208));
            uVar12 = uVar12 + 8;
          } while ((uVar23 + 8 & 0x1fffffff8) != uVar12);
          auVar112 = vorps_avx(auVar168,auVar176);
          auVar94._0_8_ = auVar151._0_8_ ^ 0x8000000000000000;
          auVar94._12_4_ = auVar151._12_4_ ^ 0x80000000;
          auVar112 = vpcmpgtq_avx(auVar94,auVar112);
          auVar113 = vpackssdw_avx(auVar112,auVar140);
          auVar112 = vorps_avx(auVar168,auVar176);
          auVar154._0_8_ = auVar236._0_8_ ^ 0x8000000000000000;
          auVar154._8_4_ = auVar236._8_4_;
          auVar154._12_4_ = auVar236._12_4_ ^ 0x80000000;
          auVar112 = vpcmpgtq_avx(auVar154,auVar112);
          auVar112 = vpackssdw_avx(auVar112,auVar149);
          auVar112 = vblendvps_avx(auVar208,auVar185,auVar112 ^ auVar139);
          auVar113 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar113 ^ auVar139);
          auVar112 = vhaddps_avx(auVar113,auVar112);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          fVar27 = auVar112._0_4_;
          auVar175 = ZEXT3264(auVar86);
          auVar255 = ZEXT3264(_DAT_0054d860);
          auVar139 = vpcmpeqd_avx(auVar139,auVar139);
          auVar184 = ZEXT1664(auVar139);
          auVar192 = ZEXT3264(auVar192._0_32_);
        }
        auVar139 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]));
        auVar65 = auVar192._0_32_;
        auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
        if (iVar10 == 8) {
          auVar193 = ZEXT2864(CONCAT424(auVar222._24_4_ * fStack_70,
                                        CONCAT420(auVar222._20_4_ * fStack_74,
                                                  CONCAT416(auVar222._16_4_ * local_78,
                                                            CONCAT412(auVar222._12_4_ * fStack_6c,
                                                                      CONCAT48(auVar222._8_4_ *
                                                                               fStack_70,
                                                                               CONCAT44(auVar222.
                                                  _4_4_ * fStack_74,auVar222._0_4_ * local_78)))))))
          ;
        }
        auVar228 = auVar179;
        if (iVar10 == 4) {
          auVar228._0_4_ = auVar179._0_4_ + auVar222._0_4_ + auVar222._16_4_;
          auVar228._4_4_ = auVar179._4_4_ + auVar222._4_4_ + auVar222._20_4_;
          auVar228._8_4_ = auVar179._8_4_ + auVar222._8_4_ + auVar222._24_4_;
          auVar228._12_4_ = auVar179._12_4_ + auVar222._12_4_ + auVar222._28_4_;
          auVar86 = vblendps_avx(auVar193._0_32_,
                                 ZEXT1632(CONCAT412(auVar228._12_4_ * fStack_6c,
                                                    CONCAT48(auVar228._8_4_ * fStack_70,
                                                             CONCAT44(auVar228._4_4_ * fStack_74,
                                                                      auVar228._0_4_ * local_78)))),
                                 0xf);
          auVar193 = ZEXT3264(auVar86);
        }
        if (iVar10 == 1) {
          auVar112 = vshufpd_avx(auVar228,auVar228,1);
          auVar95._0_4_ = auVar228._0_4_ + auVar112._0_4_;
          auVar95._4_4_ = auVar228._4_4_ + auVar112._4_4_;
          auVar95._8_4_ = auVar228._8_4_ + auVar112._8_4_;
          auVar95._12_4_ = auVar228._12_4_ + auVar112._12_4_;
          auVar112 = vhaddps_avx(auVar222._16_16_,auVar222._0_16_);
          auVar113 = vmovshdup_avx(auVar95);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          auVar112 = vhaddps_avx(auVar112,auVar112);
          auVar86 = vblendps_avx(auVar193._0_32_,
                                 ZEXT432((uint)((fVar27 + auVar112._0_4_ + auVar113._0_4_ +
                                                auVar95._0_4_) * fVar26)),1);
          auVar193 = ZEXT3264(auVar86);
        }
        fVar27 = auVar193._0_4_;
        auVar120 = auVar193._0_32_;
        fVar207 = auVar192._0_4_;
        if (iVar10 == 1) {
          fVar27 = fVar27 + *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          auVar139 = vrsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
          auVar112 = vfmadd213ss_fma(ZEXT416((uint)(fVar27 * auVar139._0_4_)),auVar139,
                                     ZEXT416(0xc0400000));
          fVar27 = auVar139._0_4_ * -0.5 * auVar112._0_4_;
          auVar120 = vblendps_avx(auVar120,ZEXT432((uint)fVar27),1);
          auVar65 = vblendps_avx(auVar65,ZEXT432((uint)(fVar27 * -fVar207)),1);
        }
        else if (iVar10 == 4) {
          auVar139 = vshufps_avx(auVar139,auVar139,0);
          auVar32._0_4_ = fVar27 + auVar139._0_4_;
          auVar32._4_4_ = auVar193._4_4_ + auVar139._4_4_;
          auVar32._8_4_ = auVar193._8_4_ + auVar139._8_4_;
          auVar32._12_4_ = auVar193._12_4_ + auVar139._12_4_;
          auVar139 = vrsqrtps_avx(auVar32);
          auVar33._0_4_ = auVar32._0_4_ * auVar139._0_4_;
          auVar33._4_4_ = auVar32._4_4_ * auVar139._4_4_;
          auVar33._8_4_ = auVar32._8_4_ * auVar139._8_4_;
          auVar33._12_4_ = auVar32._12_4_ * auVar139._12_4_;
          auVar134._8_4_ = 0xc0400000;
          auVar134._0_8_ = 0xc0400000c0400000;
          auVar134._12_4_ = 0xc0400000;
          auVar112 = vfmadd213ps_fma(auVar33,auVar139,auVar134);
          fVar27 = auVar139._0_4_ * -0.5 * auVar112._0_4_;
          fVar88 = auVar139._4_4_ * -0.5 * auVar112._4_4_;
          fVar89 = auVar139._8_4_ * -0.5 * auVar112._8_4_;
          fVar90 = auVar139._12_4_ * -0.5 * auVar112._12_4_;
          auVar120 = vblendps_avx(auVar120,ZEXT1632(CONCAT412(fVar90,CONCAT48(fVar89,CONCAT44(fVar88
                                                  ,fVar27)))),0xf);
          auVar65 = vblendps_avx(auVar65,ZEXT1632(CONCAT412(fVar90 * -auVar192._12_4_,
                                                            CONCAT48(fVar89 * -auVar192._8_4_,
                                                                     CONCAT44(fVar88 * -auVar192.
                                                  _4_4_,fVar27 * -fVar207)))),0xf);
        }
        else if (iVar10 == 8) {
          auVar139 = vshufps_avx(auVar139,auVar139,0);
          auVar61._0_4_ = fVar27 + auVar139._0_4_;
          auVar61._4_4_ = auVar193._4_4_ + auVar139._4_4_;
          auVar61._8_4_ = auVar193._8_4_ + auVar139._8_4_;
          auVar61._12_4_ = auVar193._12_4_ + auVar139._12_4_;
          auVar61._16_4_ = auVar193._16_4_ + auVar139._0_4_;
          auVar61._20_4_ = auVar193._20_4_ + auVar139._4_4_;
          auVar61._24_4_ = auVar193._24_4_ + auVar139._8_4_;
          auVar61._28_4_ = auVar193._28_4_ + auVar139._12_4_;
          auVar86 = vrsqrtps_avx(auVar61);
          auVar5._4_4_ = auVar61._4_4_ * auVar86._4_4_;
          auVar5._0_4_ = auVar61._0_4_ * auVar86._0_4_;
          auVar5._8_4_ = auVar61._8_4_ * auVar86._8_4_;
          auVar5._12_4_ = auVar61._12_4_ * auVar86._12_4_;
          auVar5._16_4_ = auVar61._16_4_ * auVar86._16_4_;
          auVar5._20_4_ = auVar61._20_4_ * auVar86._20_4_;
          auVar5._24_4_ = auVar61._24_4_ * auVar86._24_4_;
          auVar5._28_4_ = auVar61._28_4_;
          auVar142._8_4_ = 0xc0400000;
          auVar142._0_8_ = 0xc0400000c0400000;
          auVar142._12_4_ = 0xc0400000;
          auVar142._16_4_ = 0xc0400000;
          auVar142._20_4_ = 0xc0400000;
          auVar142._24_4_ = 0xc0400000;
          auVar142._28_4_ = 0xc0400000;
          auVar139 = vfmadd213ps_fma(auVar5,auVar86,auVar142);
          auVar194._0_4_ = auVar86._0_4_ * -0.5 * auVar139._0_4_;
          auVar194._4_4_ = auVar86._4_4_ * -0.5 * auVar139._4_4_;
          auVar194._8_4_ = auVar86._8_4_ * -0.5 * auVar139._8_4_;
          auVar194._12_4_ = auVar86._12_4_ * -0.5 * auVar139._12_4_;
          auVar194._16_4_ = auVar86._16_4_ * -0.5 * 0.0;
          auVar194._20_4_ = auVar86._20_4_ * -0.5 * 0.0;
          auVar194._28_36_ = auVar193._28_36_;
          auVar194._24_4_ = auVar86._24_4_ * -0.5 * 0.0;
          auVar120 = auVar194._0_32_;
          auVar193._0_4_ = auVar194._0_4_ * -fVar207;
          auVar193._4_4_ = auVar194._4_4_ * -auVar192._4_4_;
          auVar193._8_4_ = auVar194._8_4_ * -auVar192._8_4_;
          auVar193._12_4_ = auVar194._12_4_ * -auVar192._12_4_;
          auVar193._16_4_ = auVar194._16_4_ * -auVar192._16_4_;
          auVar193._20_4_ = auVar194._20_4_ * -auVar192._20_4_;
          auVar193._28_36_ = auVar192._28_36_;
          auVar193._24_4_ = auVar194._24_4_ * -auVar192._24_4_;
          auVar65 = auVar193._0_32_;
        }
        auVar139 = auVar120._0_16_;
        auVar112 = auVar65._0_16_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
          auVar179 = auVar112;
          auVar113 = auVar139;
          if (iVar10 != 4) {
            auVar113 = vshufps_avx(auVar139,auVar139,0);
            auVar179 = vshufps_avx(auVar112,auVar112,0);
          }
          if (iVar10 != 8) {
            auVar120._16_16_ = auVar113;
            auVar120._0_16_ = auVar113;
            auVar65._16_16_ = auVar179;
            auVar65._0_16_ = auVar179;
          }
          uVar24 = 0;
          if (7 < (int)uVar15) {
            iVar9 = 8;
            do {
              auVar168 = vfmadd132ps_fma(*pauVar17,auVar65,auVar120);
              *pauVar17 = ZEXT1632(auVar168);
              pauVar17 = pauVar17 + 1;
              iVar9 = iVar9 + 8;
              uVar24 = uVar20;
            } while (iVar9 <= (int)uVar15);
          }
          uVar11 = uVar24 | 4;
          while ((int)uVar11 <= (int)uVar15) {
            auVar168 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar179,auVar113);
            *(undefined1 (*) [16])*pauVar17 = auVar168;
            pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
            uVar11 = uVar24 + 8;
            uVar24 = uVar24 + 4;
          }
          if ((int)uVar24 < (int)uVar15) {
            uVar23 = CONCAT44(0,~uVar24 + uVar15);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar23;
            auVar113 = vpshufd_avx(auVar35,0x44);
            auVar139 = vshufps_avx(auVar139,auVar139,0);
            auVar187._16_16_ = auVar139;
            auVar187._0_16_ = auVar139;
            auVar139 = vshufps_avx(auVar112,auVar112,0);
            auVar223._16_16_ = auVar139;
            auVar223._0_16_ = auVar139;
            auVar139 = vorps_avx(auVar113,auVar176);
            auVar112 = vorps_avx(auVar113,auVar176);
            uVar12 = 0;
            do {
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar12;
              auVar179 = vpshufd_avx(auVar36,0x44);
              auVar66._16_16_ = auVar179;
              auVar66._0_16_ = auVar179;
              auVar86 = vorps_avx(auVar66,auVar175._0_32_);
              auVar222 = vorps_avx(auVar255._0_32_,auVar66);
              auVar179 = vorps_avx(auVar113,auVar176);
              auVar155._0_8_ = auVar222._16_8_ ^ 0x8000000000000000;
              auVar155._8_4_ = auVar222._24_4_;
              auVar155._12_4_ = auVar222._28_4_ ^ 0x80000000;
              auVar168 = vpcmpgtq_avx(auVar155,auVar179);
              auVar37._0_8_ = auVar222._0_8_ ^ 0x8000000000000000;
              auVar37._8_4_ = auVar222._8_4_;
              auVar37._12_4_ = auVar222._12_4_ ^ 0x80000000;
              auVar185 = vpcmpgtq_avx(auVar37,auVar139);
              auVar168 = vpackssdw_avx(auVar185,auVar168);
              auVar156._0_8_ = auVar86._16_8_ ^ 0x8000000000000000;
              auVar156._8_4_ = auVar86._24_4_;
              auVar156._12_4_ = auVar86._28_4_ ^ 0x80000000;
              auVar179 = vpcmpgtq_avx(auVar156,auVar179);
              auVar175 = ZEXT3264(auVar175._0_32_);
              auVar97._0_8_ = auVar86._0_8_ ^ 0x8000000000000000;
              auVar97._8_4_ = auVar86._8_4_;
              auVar97._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar185 = vpcmpgtq_avx(auVar97,auVar112);
              auVar179 = vpackssdw_avx(auVar185,auVar179);
              auVar179 = vpackssdw_avx(auVar179 ^ auVar184._0_16_,auVar168 ^ auVar184._0_16_);
              auVar168 = vpmovsxwd_avx(auVar179);
              auVar179 = vpunpckhwd_avx(auVar179,auVar179);
              auVar67._16_16_ = auVar179;
              auVar67._0_16_ = auVar168;
              auVar86 = vmaskmovps_avx(auVar67,*(undefined1 (*) [32])(*pauVar17 + uVar12 * 4));
              auVar179 = vfmadd213ps_fma(auVar86,auVar187,auVar223);
              auVar86 = vmaskmovps_avx(auVar67,ZEXT1632(auVar179));
              *(undefined1 (*) [32])(*pauVar17 + uVar12 * 4) = auVar86;
              uVar12 = uVar12 + 8;
            } while ((uVar23 + 8 & 0x1fffffff8) != uVar12);
          }
        }
        else {
          pauVar8 = pauVar14;
          pauVar21 = pauVar25;
          if (7 < (int)uVar15 && iVar10 == 8) {
            iVar9 = 8;
            do {
              uVar1 = *(undefined4 *)*pauVar8;
              auVar62._4_4_ = uVar1;
              auVar62._0_4_ = uVar1;
              auVar62._8_4_ = uVar1;
              auVar62._12_4_ = uVar1;
              auVar62._16_4_ = uVar1;
              auVar62._20_4_ = uVar1;
              auVar62._24_4_ = uVar1;
              auVar62._28_4_ = uVar1;
              uVar1 = *(undefined4 *)*pauVar21;
              auVar117._4_4_ = uVar1;
              auVar117._0_4_ = uVar1;
              auVar117._8_4_ = uVar1;
              auVar117._12_4_ = uVar1;
              auVar117._16_4_ = uVar1;
              auVar117._20_4_ = uVar1;
              auVar117._24_4_ = uVar1;
              auVar117._28_4_ = uVar1;
              auVar113 = vfmadd132ps_fma(*pauVar17,auVar65,auVar120);
              auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar62,auVar117);
              *pauVar17 = ZEXT1632(auVar113);
              pauVar17 = pauVar17 + 1;
              pauVar8 = (undefined1 (*) [32])(*pauVar8 + 4);
              pauVar21 = (undefined1 (*) [32])(*pauVar21 + 4);
              iVar9 = iVar9 + 8;
            } while (iVar9 <= (int)uVar15);
          }
          if (iVar10 == 4) {
            uVar24 = 4;
            if (7 < (int)uVar15) {
              auVar143._16_16_ = auVar139;
              auVar143._0_16_ = auVar139;
              auVar203._16_16_ = auVar112;
              auVar203._0_16_ = auVar112;
              iVar9 = 8;
              do {
                uVar1 = *(undefined4 *)*pauVar8;
                auVar63._4_4_ = uVar1;
                auVar63._0_4_ = uVar1;
                auVar63._8_4_ = uVar1;
                auVar63._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(*pauVar8 + 4);
                auVar63._20_4_ = uVar1;
                auVar63._16_4_ = uVar1;
                auVar63._24_4_ = uVar1;
                auVar63._28_4_ = uVar1;
                uVar1 = *(undefined4 *)*pauVar21;
                auVar118._4_4_ = uVar1;
                auVar118._0_4_ = uVar1;
                auVar118._8_4_ = uVar1;
                auVar118._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(*pauVar21 + 4);
                auVar118._20_4_ = uVar1;
                auVar118._16_4_ = uVar1;
                auVar118._24_4_ = uVar1;
                auVar118._28_4_ = uVar1;
                auVar113 = vfmadd132ps_fma(*pauVar17,auVar203,auVar143);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar63,auVar118);
                *pauVar17 = ZEXT1632(auVar113);
                pauVar17 = pauVar17 + 1;
                pauVar8 = (undefined1 (*) [32])(*pauVar8 + 8);
                pauVar21 = (undefined1 (*) [32])(*pauVar21 + 8);
                iVar9 = iVar9 + 8;
                uVar24 = uVar15 | 4;
              } while (iVar9 <= (int)uVar15);
            }
            for (; (int)uVar24 <= (int)uVar15; uVar24 = uVar24 + 4) {
              uVar1 = *(undefined4 *)*pauVar8;
              auVar34._4_4_ = uVar1;
              auVar34._0_4_ = uVar1;
              auVar34._8_4_ = uVar1;
              auVar34._12_4_ = uVar1;
              uVar1 = *(undefined4 *)*pauVar21;
              auVar96._4_4_ = uVar1;
              auVar96._0_4_ = uVar1;
              auVar96._8_4_ = uVar1;
              auVar96._12_4_ = uVar1;
              auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar112,auVar139);
              auVar113 = vfmadd213ps_fma(auVar113,auVar34,auVar96);
              *(undefined1 (*) [16])*pauVar17 = auVar113;
              pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
              pauVar8 = (undefined1 (*) [32])(*pauVar8 + 4);
              pauVar21 = (undefined1 (*) [32])(*pauVar21 + 4);
            }
          }
          if (iVar10 == 1) {
            auVar113 = vshufps_avx(auVar139,auVar139,0);
            auVar179 = vshufps_avx(auVar112,auVar112,0);
            uVar24 = 0;
            if (7 < (int)uVar15) {
              auVar64._16_16_ = auVar113;
              auVar64._0_16_ = auVar113;
              auVar119._16_16_ = auVar179;
              auVar119._0_16_ = auVar179;
              iVar9 = 8;
              do {
                auVar168 = vfmadd132ps_fma(*pauVar17,auVar119,auVar64);
                auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),*pauVar8,*pauVar21);
                *pauVar17 = ZEXT1632(auVar168);
                pauVar17 = pauVar17 + 1;
                pauVar8 = pauVar8 + 1;
                pauVar21 = pauVar21 + 1;
                iVar9 = iVar9 + 8;
                uVar24 = uVar20;
              } while (iVar9 <= (int)uVar15);
            }
            uVar11 = uVar24 | 4;
            while ((int)uVar11 <= (int)uVar15) {
              auVar168 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar17,auVar179,auVar113);
              auVar168 = vfmadd213ps_fma(auVar168,*(undefined1 (*) [16])*pauVar8,
                                         *(undefined1 (*) [16])*pauVar21);
              *(undefined1 (*) [16])*pauVar17 = auVar168;
              pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
              pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
              pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
              uVar11 = uVar24 + 8;
              uVar24 = uVar24 + 4;
            }
            if (uVar15 - uVar24 != 0 && (int)uVar24 <= (int)uVar15) {
              lVar13 = 0;
              do {
                auVar113 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar17 + lVar13 * 4)),auVar112,
                                           auVar139);
                auVar113 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar8 + lVar13 * 4)),auVar113,
                                           ZEXT416(*(uint *)(*pauVar21 + lVar13 * 4)));
                *(int *)(*pauVar17 + lVar13 * 4) = auVar113._0_4_;
                lVar13 = lVar13 + 1;
              } while (uVar15 - uVar24 != (int)lVar13);
            }
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar16);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}